

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O1

int LZ4HC_compress_optimal
              (LZ4HC_CCtx_internal *ctx,char *source,char *dst,int *srcSizePtr,int dstCapacity,
              int nbSearches,size_t sufficient_len,limitedOutput_directive limit,int fullUpdate,
              dictCtx_directive dict,HCfavor_e favorDecSpeed)

{
  short *psVar1;
  ushort uVar2;
  int iVar3;
  U32 UVar4;
  byte bVar5;
  int price;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  long lVar9;
  ulong *iEnd;
  ulong uVar10;
  uint *puVar11;
  ulong uVar12;
  uint *puVar13;
  short *psVar14;
  uint *__src;
  BYTE *pBVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong *puVar19;
  int *piVar20;
  short *psVar21;
  U32 target;
  ulong uVar22;
  long lVar23;
  LZ4_byte *pLVar24;
  ulong uVar25;
  LZ4_byte *pLVar26;
  LZ4_byte *pLVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  ulong *puVar31;
  uint uVar32;
  uint uVar33;
  BYTE *pBVar34;
  uint uVar35;
  uint uVar36;
  int iVar37;
  ulong uVar38;
  ulong *puVar39;
  ulong *puVar40;
  int iVar41;
  LZ4HC_CCtx_internal *pLVar42;
  int iVar43;
  ulong uVar44;
  ulong uVar45;
  ulong *puVar46;
  ulong *puVar47;
  int iVar48;
  BYTE *e_2;
  uint uVar49;
  byte bVar50;
  BYTE *e;
  short *psVar51;
  int offset;
  ulong *puVar52;
  bool bVar53;
  U32 *hashTable;
  BYTE *base_1;
  uint *local_1f8;
  int local_1dc;
  int local_1d8;
  undefined4 local_1bc;
  LZ4_byte *local_1b8;
  LZ4_byte *local_1b0;
  ulong local_1a8;
  undefined8 local_1a0;
  short *local_198;
  void *local_190;
  ulong *local_188;
  ulong *local_180;
  ulong local_178;
  ulong *local_170;
  ulong *local_168;
  uint *local_160;
  ulong local_158;
  LZ4_byte *local_150;
  int local_144;
  short *local_140;
  ulong local_138;
  ulong *local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong *local_110;
  int local_104;
  ulong *local_100;
  ulong *local_f8;
  ulong *local_f0;
  BYTE *local_e8;
  LZ4HC_CCtx_internal *local_e0;
  ulong local_d8;
  ulong *local_d0;
  int local_c4;
  int local_c0;
  uint local_bc;
  long local_b8;
  ulong *local_b0;
  ulong *local_a8;
  uint local_9c;
  char *local_98;
  char *local_90;
  char *local_88;
  long local_80;
  size_t local_78;
  int *local_70;
  uint *local_68;
  int *local_60;
  int *local_58;
  ulong local_50;
  int *local_48;
  int *local_40;
  long local_38;
  
  local_104 = nbSearches;
  pvVar8 = malloc(0x10030);
  iVar48 = 0;
  if (pvVar8 == (void *)0x0) goto LAB_00120676;
  lVar9 = (long)*srcSizePtr;
  local_88 = source + lVar9;
  local_68 = (uint *)(source + lVar9 + -0xc);
  *srcSizePtr = 0;
  local_e8 = (BYTE *)(dst + (ulong)(limit != fillOutput) * 5 + (long)dstCapacity + -5);
  local_78 = 0xfff;
  if (sufficient_len < 0xfff) {
    local_78 = sufficient_len;
  }
  __src = (uint *)source;
  local_98 = source;
  local_90 = dst;
  local_60 = srcSizePtr;
  if (source <= local_68) {
    iEnd = (ulong *)(source + lVar9 + -5);
    local_168 = (ulong *)(local_88 + -0xc);
    local_f8 = (ulong *)(local_88 + -8);
    local_100 = (ulong *)(local_88 + -6);
    local_40 = (int *)((long)pvVar8 + 0xc);
    local_48 = (int *)((long)pvVar8 + 0x4c);
    local_80 = (long)pvVar8 + 0x1c;
    local_50 = (long)pvVar8 + 0x20;
    local_58 = (int *)((long)pvVar8 + 0x50);
    local_144 = 4;
    local_b8 = 0;
    local_190 = pvVar8;
    local_140 = (short *)dst;
    do {
      local_1b0 = ctx->base;
      local_1a8 = (long)source - (long)local_1b0;
      uVar35 = ctx->lowLimit;
      local_118 = (ulong)uVar35;
      local_bc = uVar35 + 0x10000;
      uVar6 = (uint)local_1a8;
      uVar33 = uVar6 - 0xffff;
      if (uVar6 < local_bc) {
        uVar33 = uVar35;
      }
      uVar35 = *(uint *)source;
      local_1a0 = CONCAT44(local_1a0._4_4_,uVar35);
      uVar10 = (ulong)ctx->nextToUpdate;
      if (ctx->nextToUpdate < uVar6) {
        do {
          uVar16 = (uint)(*(int *)(local_1b0 + uVar10) * -0x61c8864f) >> 0x11;
          uVar7 = (uint)uVar10;
          uVar28 = uVar7 - ctx->hashTable[uVar16];
          if (0xfffe < uVar28) {
            uVar28 = 0xffff;
          }
          ctx->chainTable[uVar7 & 0xffff] = (LZ4_u16)uVar28;
          ctx->hashTable[uVar16] = uVar7;
          uVar10 = uVar10 + 1;
        } while (uVar10 < (local_1a8 & 0xffffffff));
      }
      local_158 = (long)source - (long)__src;
      local_e0 = ctx->dictCtx;
      local_1b8 = ctx->dictBase;
      local_178 = (ulong)ctx->dictLimit;
      local_170 = (ulong *)(local_1b0 + local_178);
      ctx->nextToUpdate = uVar6;
      uVar25 = (ulong)ctx->hashTable[*(uint *)source * -0x61c8864f >> 0x11];
      puVar40 = (ulong *)((long)source + 4);
      local_110 = (ulong *)((long)source + 0xc);
      uVar6 = uVar35 & 0xffff;
      uVar16 = uVar35 >> 0x10;
      uVar7 = uVar35 & 0xff;
      uVar28 = uVar35 >> 0x18;
      local_188 = (ulong *)(local_1b8 + local_118);
      local_180 = (ulong *)(local_1b8 + local_178);
      local_d0 = (ulong *)(local_1b8 + local_118 + 4);
      uVar10 = 3;
      local_160 = (uint *)0x0;
      uVar22 = 0;
      local_d8 = local_d8 & 0xffffffff00000000;
      puVar52 = (ulong *)0x0;
      iVar48 = local_104;
      local_198 = (short *)dst;
      do {
        uVar49 = (uint)uVar25;
        local_1d8 = (int)puVar40;
        if ((uVar49 < uVar33) || (iVar48 < 1)) break;
        uVar38 = 0;
        if ((favorDecSpeed == favorCompressionRatio) || (uVar36 = 0, 7 < (uint)local_1a8 - uVar49))
        {
          uVar17 = (uint)local_178 - uVar49;
          iVar18 = (int)uVar10;
          if ((uint)local_178 < uVar49 || uVar17 == 0) {
            puVar11 = (uint *)(local_1b0 + uVar25);
            uVar36 = 0;
            if ((*(short *)((long)source + (long)iVar18 + -1) !=
                 *(short *)((long)iVar18 + -1 + (long)puVar11)) || (uVar36 = 0, *puVar11 != uVar35))
            goto LAB_0011d966;
            puVar19 = (ulong *)(puVar11 + 1);
            puVar31 = puVar40;
            if (puVar40 < local_168) {
              uVar12 = *puVar40 ^ *(ulong *)(puVar11 + 1);
              uVar38 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              uVar38 = uVar38 >> 3 & 0x1fffffff;
              iVar29 = (int)uVar38;
              puVar19 = (ulong *)(puVar11 + 3);
              puVar31 = local_110;
              uVar35 = (uint)local_1a0;
              if (*(ulong *)(puVar11 + 1) == *puVar40) goto LAB_0011d892;
            }
            else {
LAB_0011d892:
              do {
                if (local_168 <= puVar31) {
                  if ((puVar31 < local_f8) && ((uint)*puVar19 == (uint)*puVar31)) {
                    puVar31 = (ulong *)((long)puVar31 + 4);
                    puVar19 = (ulong *)((long)puVar19 + 4);
                  }
                  if ((puVar31 < local_100) && ((short)*puVar19 == (short)*puVar31)) {
                    puVar31 = (ulong *)((long)puVar31 + 2);
                    puVar19 = (ulong *)((long)puVar19 + 2);
                  }
                  if (puVar31 < iEnd) {
                    puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar31));
                  }
                  iVar29 = (int)puVar31 - local_1d8;
                  break;
                }
                uVar12 = *puVar19;
                uVar45 = *puVar31;
                uVar44 = 0;
                if ((uVar45 ^ uVar12) != 0) {
                  for (; ((uVar45 ^ uVar12) >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                  }
                }
                puVar39 = (ulong *)((uVar44 >> 3 & 0x1fffffff) + (long)puVar31);
                puVar19 = puVar19 + 1;
                puVar31 = puVar31 + 1;
                if (uVar12 != uVar45) {
                  uVar38 = (ulong)(uint)((int)puVar39 - local_1d8);
                  puVar31 = puVar39;
                }
                iVar29 = (int)uVar38;
                uVar35 = (uint)local_1a0;
              } while (uVar12 == uVar45);
            }
            uVar36 = iVar29 + 4;
            if (iVar18 < (int)uVar36) {
              local_160 = puVar11;
            }
            uVar10 = uVar10 & 0xffffffff;
            if (iVar18 < (int)uVar36) {
              uVar10 = (ulong)uVar36;
            }
          }
          else {
            uVar36 = 0;
            if (*(uint *)(local_1b8 + uVar25) != uVar35) goto LAB_0011d966;
            puVar19 = (ulong *)((ulong)uVar17 + (long)source);
            if (iEnd < puVar19) {
              puVar19 = iEnd;
            }
            puVar31 = (ulong *)(local_1b8 + uVar25 + 4);
            puVar39 = puVar40;
            if (puVar40 < (ulong *)((long)puVar19 + -7)) {
              uVar38 = *puVar40 ^ *(ulong *)(local_1b8 + uVar25 + 4);
              lVar9 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                }
              }
              uVar35 = (uint)lVar9 >> 3;
              puVar31 = (ulong *)(local_1b8 + uVar25 + 0xc);
              puVar39 = local_110;
              if (*(ulong *)(local_1b8 + uVar25 + 4) == *puVar40) goto LAB_0011d70f;
            }
            else {
LAB_0011d70f:
              do {
                if ((ulong *)((long)puVar19 + -7) <= puVar39) {
                  if ((puVar39 < (ulong *)((long)puVar19 + -3)) &&
                     ((uint)*puVar31 == (uint)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 4);
                    puVar31 = (ulong *)((long)puVar31 + 4);
                  }
                  if ((puVar39 < (ulong *)((long)puVar19 + -1)) &&
                     ((short)*puVar31 == (short)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 2);
                    puVar31 = (ulong *)((long)puVar31 + 2);
                  }
                  if (puVar39 < puVar19) {
                    puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar39));
                  }
                  uVar35 = (int)puVar39 - local_1d8;
                  break;
                }
                uVar38 = *puVar31;
                uVar12 = *puVar39;
                uVar44 = uVar12 ^ uVar38;
                uVar45 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                  }
                }
                uVar35 = (((uint)(uVar45 >> 3) & 0x1fffffff) + (int)puVar39) - local_1d8;
                puVar31 = puVar31 + 1;
                puVar39 = puVar39 + 1;
              } while (uVar38 == uVar12);
            }
            uVar38 = (ulong)(uVar35 + 4);
            if ((puVar19 < iEnd) &&
               (puVar31 = (ulong *)((long)source + (long)(int)uVar35 + 4), puVar31 == puVar19)) {
              puVar39 = puVar31;
              puVar19 = local_170;
              if (puVar31 < local_168) {
                uVar38 = *local_170;
                uVar12 = *puVar31;
                lVar9 = 0;
                if ((uVar12 ^ uVar38) != 0) {
                  for (; ((uVar12 ^ uVar38) >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                  }
                }
                uVar36 = (uint)lVar9 >> 3;
                if (uVar38 == uVar12) {
                  puVar19 = local_170 + (uVar38 == uVar12);
                  puVar39 = puVar31 + (uVar38 == uVar12);
                  goto LAB_0011d7d2;
                }
              }
              else {
LAB_0011d7d2:
                do {
                  if (local_168 <= puVar39) {
                    if ((puVar39 < local_f8) && ((uint)*puVar19 == (uint)*puVar39)) {
                      puVar39 = (ulong *)((long)puVar39 + 4);
                      puVar19 = (ulong *)((long)puVar19 + 4);
                    }
                    if ((puVar39 < local_100) && ((short)*puVar19 == (short)*puVar39)) {
                      puVar39 = (ulong *)((long)puVar39 + 2);
                      puVar19 = (ulong *)((long)puVar19 + 2);
                    }
                    if (puVar39 < iEnd) {
                      puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar39))
                      ;
                    }
                    uVar36 = (int)puVar39 - (int)puVar31;
                    break;
                  }
                  uVar38 = *puVar19;
                  uVar12 = *puVar39;
                  uVar44 = uVar12 ^ uVar38;
                  uVar45 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  uVar36 = (((uint)(uVar45 >> 3) & 0x1fffffff) + (int)puVar39) - (int)puVar31;
                  puVar39 = puVar39 + 1;
                  puVar19 = puVar19 + 1;
                } while (uVar38 == uVar12);
              }
              uVar38 = (ulong)(uVar35 + 4 + uVar36);
            }
            uVar36 = (uint)uVar38;
            if (iVar18 < (int)uVar36) {
              local_160 = (uint *)(local_1b0 + uVar25);
            }
            uVar10 = uVar10 & 0xffffffff;
            uVar35 = (uint)local_1a0;
            if (iVar18 < (int)uVar36) {
              uVar10 = uVar38;
            }
          }
        }
LAB_0011d966:
        uVar17 = (uint)uVar10;
        if ((uVar36 == uVar17) && (uVar17 + uVar49 <= (uint)local_1a8)) {
          uVar36 = 1;
          if (3 < (int)uVar17) {
            uVar35 = 0;
            iVar18 = 0x10;
            do {
              uVar2 = ctx->chainTable[uVar35 + uVar49 & 0xffff];
              iVar29 = iVar18 >> 4;
              uVar32 = (uint)uVar2;
              bVar53 = uVar36 < uVar32;
              iVar18 = iVar18 + 1;
              if (bVar53) {
                iVar18 = 0x10;
              }
              if (uVar36 <= uVar32) {
                uVar36 = (uint)uVar2;
              }
              if (bVar53) {
                puVar52 = (ulong *)(ulong)uVar35;
              }
              uVar35 = iVar29 + uVar35;
            } while ((int)uVar35 < (int)(uVar17 - 3));
          }
          uVar35 = uVar36;
          if (uVar49 < uVar36) {
            uVar35 = 0;
          }
          bVar50 = uVar49 < uVar36 | 2;
          if (uVar36 < 2) {
            uVar35 = 0;
            bVar50 = 0;
          }
          uVar25 = (ulong)(uVar49 - uVar35);
          uVar35 = (uint)local_1a0;
          if (uVar36 < 2) goto LAB_0011da04;
        }
        else {
LAB_0011da04:
          bVar50 = 0;
          if ((ctx->chainTable[uVar25 & 0xffff] == 1) && ((int)puVar52 == 0)) {
            iVar18 = (int)local_d8;
            if ((int)local_d8 == 0) {
              iVar18 = 1;
            }
            if ((int)local_d8 == 0 && (uVar28 == uVar7 && uVar16 == uVar6)) {
              uVar35 = LZ4HC_countPattern((BYTE *)puVar40,(BYTE *)iEnd,uVar35);
              uVar22 = (ulong)uVar35 + 4;
              iVar18 = 2;
              uVar35 = (uint)local_1a0;
            }
            local_d8 = CONCAT44(local_d8._4_4_,iVar18);
            bVar50 = 0;
            if (((iVar18 == 2) && (uVar49 = (int)uVar25 - 1, uVar33 <= uVar49)) &&
               (uVar36 = (uint)local_178, bVar50 = 0, uVar49 - uVar36 < 0xfffffffd)) {
              pLVar24 = local_1b8;
              if (uVar36 <= uVar49) {
                pLVar24 = local_1b0;
              }
              if (*(U32 *)(pLVar24 + uVar49) == uVar35) {
                puVar31 = (ulong *)(pLVar24 + uVar49);
                puVar19 = local_180;
                if (uVar36 <= uVar49) {
                  puVar19 = iEnd;
                }
                local_120 = uVar10;
                uVar17 = LZ4HC_countPattern((BYTE *)((long)puVar31 + 4),(BYTE *)puVar19,uVar35);
                uVar38 = (ulong)uVar17 + 4;
                uVar35 = (uint)local_1a0;
                puVar39 = local_170;
                if ((uVar49 < uVar36) &&
                   (puVar39 = local_188, (ulong *)((long)puVar31 + uVar38) == puVar19)) {
                  bVar50 = (char)uVar17 * '\b' & 0x1f;
                  UVar4 = (uint)local_1a0 << bVar50 | (uint)local_1a0 >> 0x20 - bVar50;
                  if ((uVar17 & 3) == 0) {
                    UVar4 = (uint)local_1a0;
                  }
                  uVar36 = LZ4HC_countPattern((BYTE *)local_170,(BYTE *)iEnd,UVar4);
                  uVar38 = uVar38 + uVar36;
                  puVar39 = local_188;
                }
                local_1bc = uVar35;
                puVar19 = puVar31;
                do {
                  puVar46 = puVar19;
                  if (puVar46 < (ulong *)((long)puVar39 + 4U)) break;
                  puVar19 = (ulong *)((long)puVar46 + -4);
                } while (*(uint *)((long)puVar46 + -4) == uVar35);
                puVar19 = puVar46;
                if (puVar39 < puVar46) {
                  lVar9 = 0;
                  do {
                    if (*(char *)((long)puVar46 + lVar9 + -1) !=
                        *(char *)((long)&local_1bc + lVar9 + 3)) {
                      puVar19 = (ulong *)((long)puVar46 + lVar9);
                      break;
                    }
                    lVar23 = lVar9 + -1;
                    lVar9 = lVar9 + -1;
                    puVar19 = puVar39;
                  } while (puVar39 < (ulong *)((long)puVar46 + lVar23));
                }
                uVar36 = (uint)local_178;
                uVar10 = (long)puVar31 - (long)puVar19;
                iVar18 = (int)uVar10;
                if (((uint)local_118 < uVar36 && uVar36 <= uVar49) &&
                    (ulong *)((long)puVar31 - (uVar10 & 0xffffffff)) == local_170) {
                  bVar50 = (char)uVar10 * -8 & 0x1f;
                  puVar19 = local_180;
                  local_1bc = uVar35 << bVar50 | uVar35 >> 0x20 - bVar50;
                  if ((-iVar18 & 3U) == 0) {
                    local_1bc = uVar35;
                  }
                  do {
                    puVar31 = puVar19;
                    if (puVar31 < local_d0) break;
                    puVar19 = (ulong *)((long)puVar31 + -4);
                  } while (*(uint *)((long)puVar31 + -4) == local_1bc);
                  puVar19 = puVar31;
                  if (local_188 < puVar31) {
                    lVar9 = 0;
                    do {
                      if (*(char *)((long)puVar31 + lVar9 + -1) !=
                          *(char *)((long)&local_1bc + lVar9 + 3)) {
                        puVar19 = (ulong *)((long)puVar31 + lVar9);
                        break;
                      }
                      lVar23 = lVar9 + -1;
                      lVar9 = lVar9 + -1;
                      puVar19 = local_188;
                    } while (local_188 < (ulong *)((long)puVar31 + lVar23));
                  }
                  iVar18 = ((int)local_180 - (int)puVar19) + iVar18;
                }
                uVar17 = uVar49 - iVar18;
                if (uVar49 - iVar18 <= uVar33) {
                  uVar17 = uVar33;
                }
                uVar25 = (ulong)uVar17;
                uVar12 = (uVar49 - uVar17) + uVar38;
                uVar10 = local_120;
                if ((uVar22 < uVar38) || (uVar12 < uVar22)) {
                  bVar50 = 0;
                  if (uVar17 - uVar36 < 0xfffffffd) {
                    if (uVar22 <= uVar12) {
                      uVar12 = uVar22;
                    }
                    if ((ulong)(long)(int)local_120 < uVar12) {
                      bVar50 = 3;
                      if (0xffff < local_1a8 - uVar17) goto LAB_0011ddbc;
                      local_160 = (uint *)(local_1b0 + uVar17);
                      uVar10 = uVar12 & 0xffffffff;
                    }
                    uVar49 = (uint)ctx->chainTable[uVar25 & 0xffff];
                    bVar50 = (uVar17 < uVar49) * '\x03';
                    if (uVar17 < uVar49) {
                      uVar49 = 0;
                    }
                    uVar25 = (ulong)(uVar17 - uVar49);
                  }
                  else {
                    uVar25 = local_178 & 0xffffffff;
                  }
                }
                else {
                  uVar49 = (uVar49 - (int)uVar22) + (int)uVar38;
                  uVar25 = (ulong)uVar49;
                  if (0xfffffffc < uVar49 - uVar36) {
                    uVar25 = local_178 & 0xffffffff;
                  }
                  bVar50 = 0;
                }
LAB_0011ddbc:
                if (bVar50 == 0) {
                  bVar50 = 2;
                }
              }
            }
          }
          if (bVar50 == 0) {
            uVar25 = (ulong)((int)uVar25 -
                            (uint)ctx->chainTable[(int)puVar52 + (int)uVar25 & 0xffff]);
            bVar50 = 0;
          }
        }
        iVar48 = iVar48 + -1;
      } while (bVar50 != 3);
      uVar22 = local_158;
      uVar6 = (uint)uVar10;
      if (((dict == usingDictCtxHc) && (0 < iVar48)) && ((int)local_1a8 - uVar33 < 0xffff)) {
        pLVar24 = local_e0->base;
        puVar19 = (ulong *)(local_e0->end + -(long)pLVar24);
        uVar7 = local_e0->hashTable[*(uint *)source * -0x61c8864f >> 0x11];
        puVar52 = puVar19;
        for (uVar33 = (uVar33 + uVar7) - (int)puVar19; (int)local_1a8 - uVar33 < 0x10000;
            uVar33 = uVar33 - local_e0->chainTable[uVar16]) {
          uVar6 = (uint)uVar10;
          bVar53 = iVar48 == 0;
          iVar48 = iVar48 + -1;
          if (bVar53) break;
          uVar25 = (ulong)uVar7;
          if (*(uint *)(pLVar24 + uVar25) == uVar35) {
            puVar31 = (ulong *)(((long)puVar19 - uVar25) + (long)source);
            if (iEnd < puVar31) {
              puVar31 = iEnd;
            }
            puVar39 = (ulong *)(pLVar24 + uVar25 + 4);
            puVar46 = puVar40;
            pLVar42 = ctx;
            puVar52 = puVar40;
            if (puVar40 < (ulong *)((long)puVar31 + -7)) {
              uVar12 = *puVar40 ^ *(ulong *)(pLVar24 + uVar25 + 4);
              uVar38 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              pLVar42 = (LZ4HC_CCtx_internal *)(uVar38 >> 3 & 0x1fffffff);
              iVar18 = (int)pLVar42;
              puVar39 = (ulong *)(pLVar24 + uVar25 + 0xc);
              puVar46 = local_110;
              if (*(ulong *)(pLVar24 + uVar25 + 4) == *puVar40) goto LAB_0011e01b;
            }
            else {
LAB_0011e01b:
              do {
                if ((ulong *)((long)puVar31 + -7) <= puVar46) {
                  if ((puVar46 < (ulong *)((long)puVar31 + -3)) &&
                     ((uint)*puVar39 == (uint)*puVar46)) {
                    puVar46 = (ulong *)((long)puVar46 + 4);
                    puVar39 = (ulong *)((long)puVar39 + 4);
                  }
                  if ((puVar46 < (ulong *)((long)puVar31 + -1)) &&
                     ((short)*puVar39 == (short)*puVar46)) {
                    puVar46 = (ulong *)((long)puVar46 + 2);
                    puVar39 = (ulong *)((long)puVar39 + 2);
                  }
                  if (puVar46 < puVar31) {
                    puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar39 == (BYTE)*puVar46));
                  }
                  iVar18 = (int)puVar46 - local_1d8;
                  break;
                }
                uVar25 = *puVar39;
                uVar12 = *puVar46 ^ uVar25;
                uVar38 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                puVar52 = (ulong *)((uVar38 >> 3 & 0x1fffffff) + (long)puVar46);
                puVar39 = puVar39 + 1;
                bVar53 = uVar25 == *puVar46;
                puVar46 = puVar46 + 1;
                if (!bVar53) {
                  puVar46 = puVar52;
                }
                pLVar42 = (LZ4HC_CCtx_internal *)((ulong)pLVar42 & 0xffffffff);
                if (!bVar53) {
                  pLVar42 = (LZ4HC_CCtx_internal *)(ulong)(uint)((int)puVar52 - local_1d8);
                }
                iVar18 = (int)pLVar42;
              } while (bVar53);
            }
            uVar35 = (uint)local_1a0;
            if ((int)uVar6 < (int)(iVar18 + 4U)) {
              local_160 = (uint *)(local_1b0 + uVar33);
              uVar10 = (ulong)(iVar18 + 4U);
            }
          }
          uVar6 = (uint)uVar10;
          uVar16 = uVar7 & 0xffff;
          uVar7 = uVar7 - local_e0->chainTable[uVar16];
        }
      }
      iVar18 = (int)puVar52;
      iVar48 = (int)source;
      if ((int)uVar6 < 4) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)uVar6;
        if (uVar6 - 0x13 < 0x12) {
          uVar10 = 0x12;
        }
        if (favorDecSpeed == favorCompressionRatio) {
          uVar10 = (ulong)uVar6;
        }
        uVar10 = (ulong)(uint)(iVar48 - (int)local_160) | uVar10 << 0x20;
      }
      uVar25 = uVar10 >> 0x20;
      pvVar8 = local_190;
      dst = (char *)local_198;
      if (uVar25 == 0) {
        local_1f8 = (uint *)((long)source + 1);
        bVar50 = 3;
        psVar21 = local_140;
      }
      else {
        uVar38 = (long)uVar10 >> 0x20;
        iVar29 = (int)local_158;
        local_1f8 = (uint *)source;
        local_1a8 = uVar25;
        if (local_78 < uVar38) {
          dst = (char *)((long)local_198 + 1);
          if ((limit == notLimited) ||
             ((BYTE *)((long)local_198 + local_158 + local_158 / 0xff + 9) <= local_e8)) {
            if (local_158 < 0xf) {
              *(char *)local_198 = (char)local_158 << 4;
              psVar21 = (short *)dst;
            }
            else {
              uVar25 = local_158 - 0xf;
              *(BYTE *)local_198 = 0xf0;
              if (0xfe < uVar25) {
                uVar25 = (local_158 - 0x10e) / 0xff;
                memset(dst,0xff,uVar25 + 1);
                dst = (char *)((long)local_198 + uVar25 + 2);
                uVar25 = (uVar22 + uVar25 * -0xff) - 0x10e;
              }
              *dst = (BYTE)uVar25;
              psVar21 = (short *)((long)dst + 1);
            }
            pvVar8 = local_190;
            pBVar34 = (BYTE *)(uVar22 + (long)psVar21);
            lVar9 = 0;
            do {
              pBVar15 = (BYTE *)((long)psVar21 + lVar9);
              *(undefined8 *)pBVar15 = *(undefined8 *)((long)__src + lVar9);
              lVar9 = lVar9 + 8;
            } while (pBVar15 + 8 < pBVar34);
            uVar22 = uVar38 - 4;
            dst = (char *)(pBVar34 + 2);
            *(short *)pBVar34 = (short)uVar10;
            if ((limit == notLimited) || (pBVar34 + uVar22 / 0xff + 8 <= local_e8)) {
              if (uVar22 < 0xf) {
                *(BYTE *)local_198 = (BYTE)*local_198 + (char)uVar22;
              }
              else {
                *(BYTE *)local_198 = (BYTE)*local_198 + '\x0f';
                uVar22 = uVar38 - 0x13;
                if (0x1fd < uVar22) {
                  puVar52 = (ulong *)((uVar38 - 0x211) / 0x1fe);
                  memset(dst,0xff,(long)puVar52 * 2 + 2);
                  dst = (char *)((long)psVar21 +
                                (long)source + ((long)puVar52 * 2 - (long)__src) + 4);
                  uVar22 = ((long)puVar52 * -0x1fe + uVar38) - 0x211;
                }
                iVar18 = (int)puVar52;
                if (0xfe < uVar22) {
                  uVar22 = uVar22 - 0xff;
                  *dst = 0xff;
                  dst = (char *)((long)dst + 1);
                }
                *dst = (BYTE)uVar22;
                dst = (char *)((long)dst + 1);
              }
              local_1f8 = (uint *)(uVar38 + (long)source);
              bVar5 = 1;
              __src = local_1f8;
            }
            else {
              bVar5 = 0;
            }
          }
          else {
            bVar5 = 0;
          }
          if (bVar5 == 0) {
            local_b8 = (long)source - (long)(int)uVar10;
          }
          bVar50 = (bVar5 ^ 1) * '\x02' + 3;
          psVar21 = local_198;
          uVar25 = local_1a8;
          if (bVar5 == 0) {
            psVar21 = local_198;
            local_144 = (uint)local_1a8;
          }
        }
        else {
          iVar18 = iVar48 - (int)__src;
          uVar35 = iVar18 - 0xf;
          lVar9 = 0;
          piVar20 = local_40;
          do {
            iVar37 = iVar29;
            if (0xe < iVar29 + lVar9) {
              iVar37 = uVar35 / 0xff + iVar18 + 1;
            }
            piVar20[-2] = 0;
            piVar20[-1] = 1;
            *piVar20 = iVar18 + (int)lVar9;
            piVar20[-3] = iVar37 + (int)lVar9;
            lVar9 = lVar9 + 1;
            uVar35 = uVar35 + 1;
            piVar20 = piVar20 + 4;
          } while (lVar9 != 4);
          local_1a8._0_4_ = (uint)(uVar10 >> 0x20);
          if (3 < (int)(uint)local_1a8) {
            iVar18 = iVar29 + 1 + (iVar29 - 0xfU) / 0xff;
            if (iVar29 < 0xf) {
              iVar18 = iVar29;
            }
            uVar12 = 0xfffffff1;
            uVar22 = 4;
            piVar20 = local_48;
            do {
              iVar37 = iVar18 + 3;
              if (0x12 < uVar22) {
                iVar37 = (int)(uVar12 / 0xff) + iVar18 + 3 + 1;
              }
              piVar20[-1] = (int)uVar22;
              piVar20[-2] = (int)uVar10;
              *piVar20 = iVar29;
              piVar20[-3] = iVar37;
              uVar12 = (ulong)((int)uVar12 + 1);
              piVar20 = piVar20 + 4;
              bVar53 = uVar22 != uVar25;
              uVar22 = uVar22 + 1;
            } while (bVar53);
          }
          lVar23 = uVar38 * 0x10 + local_80;
          iVar18 = 1;
          lVar9 = 0;
          do {
            *(undefined8 *)(lVar23 + -8 + lVar9) = 0x100000000;
            *(int *)(lVar23 + lVar9) = iVar18;
            *(int *)(lVar23 + -0xc + lVar9) = *(int *)(uVar38 * 0x10 + (long)local_190) + iVar18;
            lVar9 = lVar9 + 0x10;
            iVar18 = iVar18 + 1;
          } while (lVar9 != 0x30);
          bVar53 = 1 < (int)(uint)local_1a8;
          if (bVar53) {
            local_a8 = (ulong *)(local_1b8 + local_118);
            local_f0 = (ulong *)(local_1b8 + local_178);
            local_b0 = (ulong *)(local_1b8 + local_118);
            iVar48 = iVar48 - (int)local_1b0;
            uVar10 = 1;
            local_110 = (ulong *)0x5;
            local_70 = local_58;
            local_d8 = local_50;
            pLVar24 = local_1b0;
            do {
              local_120 = (ulong)(iVar48 + 1);
              puVar11 = (uint *)((long)source + uVar10);
              bVar50 = 0xf;
              local_158 = uVar10;
              if (puVar11 <= local_68) {
                lVar9 = uVar10 * 0x10;
                local_160 = (uint *)(lVar9 + (long)pvVar8);
                iVar48 = *(int *)((long)pvVar8 + lVar9);
                iVar18 = *(int *)((long)pvVar8 + lVar9 + 0x10);
                dst = (char *)local_198;
                if (fullUpdate == 0) {
                  bVar50 = 0x11;
                  if (iVar48 < iVar18) goto LAB_0011e456;
                }
                else if ((iVar48 < iVar18) || (bVar50 = 0x11, iVar48 + 3 <= (int)local_160[0x10])) {
LAB_0011e456:
                  local_38 = lVar9;
                  if (fullUpdate == 0) {
                    local_1a0 = (long)puVar11 - (long)pLVar24;
                    uVar35 = (uint)local_1a0;
                    uVar6 = uVar35 - 0xffff;
                    if (uVar35 < local_bc) {
                      uVar6 = (uint)local_118;
                    }
                    uVar33 = *puVar11;
                    uVar22 = (ulong)ctx->nextToUpdate;
                    if (ctx->nextToUpdate < uVar35) {
                      do {
                        uVar16 = (uint)(*(int *)(pLVar24 + uVar22) * -0x61c8864f) >> 0x11;
                        uVar7 = (uint)uVar22;
                        uVar28 = uVar7 - ctx->hashTable[uVar16];
                        if (0xfffe < uVar28) {
                          uVar28 = 0xffff;
                        }
                        ctx->chainTable[uVar7 & 0xffff] = (LZ4_u16)uVar28;
                        ctx->hashTable[uVar16] = uVar7;
                        uVar22 = uVar22 + 1;
                      } while (local_120 != uVar22);
                    }
                    local_158._0_4_ = (int)uVar10;
                    local_9c = (int)local_1a8 - (int)local_158;
                    ctx->nextToUpdate = uVar35;
                    uVar10 = (ulong)ctx->hashTable[*puVar11 * -0x61c8864f >> 0x11];
                    puVar40 = (ulong *)(puVar11 + 1);
                    local_130 = (ulong *)(puVar11 + 3);
                    local_128 = CONCAT71(local_128._1_7_,
                                         uVar33 >> 0x18 != (uVar33 & 0xff) ||
                                         uVar33 >> 0x10 != (uVar33 & 0xffff));
                    local_150 = (LZ4_byte *)0x0;
                    local_138 = 0;
                    local_1dc = 0;
                    puVar52 = (ulong *)0x0;
                    puVar19 = (ulong *)(ulong)local_9c;
                    pLVar24 = local_1b8;
                    iVar48 = local_104;
                    do {
                      uVar35 = (uint)uVar10;
                      iVar18 = (int)puVar40;
                      if ((uVar35 < uVar6) || (iVar48 < 1)) break;
                      uVar22 = 0;
                      iVar29 = 0;
                      if ((favorDecSpeed == favorCompressionRatio) ||
                         (iVar37 = 0, 7 < (uint)local_1a0 - uVar35)) {
                        uVar7 = (uint)local_178 - uVar35;
                        iVar30 = (int)puVar19;
                        iVar37 = iVar29;
                        if ((uint)local_178 < uVar35 || uVar7 == 0) {
                          puVar13 = (uint *)(local_1b0 + uVar10);
                          pLVar24 = local_1b8;
                          if ((*(short *)((long)puVar11 + (long)iVar30 + -1) !=
                               *(short *)((long)iVar30 + -1 + (long)puVar13)) ||
                             (*puVar13 != uVar33)) goto LAB_0011f375;
                          puVar31 = (ulong *)(puVar13 + 1);
                          puVar39 = puVar40;
                          if (puVar40 < local_168) {
                            uVar25 = *puVar40 ^ *(ulong *)(puVar13 + 1);
                            uVar22 = 0;
                            if (uVar25 != 0) {
                              for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                              }
                            }
                            uVar22 = uVar22 >> 3 & 0x1fffffff;
                            iVar29 = (int)uVar22;
                            puVar31 = (ulong *)(puVar13 + 3);
                            puVar39 = local_130;
                            if (*(ulong *)(puVar13 + 1) == *puVar40) goto LAB_0011f2d5;
                          }
                          else {
LAB_0011f2d5:
                            do {
                              if (local_168 <= puVar39) {
                                if ((puVar39 < local_f8) && ((uint)*puVar31 == (uint)*puVar39)) {
                                  puVar39 = (ulong *)((long)puVar39 + 4);
                                  puVar31 = (ulong *)((long)puVar31 + 4);
                                }
                                if ((puVar39 < local_100) && ((short)*puVar31 == (short)*puVar39)) {
                                  puVar39 = (ulong *)((long)puVar39 + 2);
                                  puVar31 = (ulong *)((long)puVar31 + 2);
                                }
                                if (puVar39 < iEnd) {
                                  puVar39 = (ulong *)((long)puVar39 +
                                                     (ulong)((BYTE)*puVar31 == (BYTE)*puVar39));
                                }
                                iVar29 = (int)puVar39 - iVar18;
                                break;
                              }
                              uVar25 = *puVar31;
                              uVar38 = *puVar39;
                              uVar12 = 0;
                              if ((uVar38 ^ uVar25) != 0) {
                                for (; ((uVar38 ^ uVar25) >> uVar12 & 1) == 0; uVar12 = uVar12 + 1)
                                {
                                }
                              }
                              puVar46 = (ulong *)((uVar12 >> 3 & 0x1fffffff) + (long)puVar39);
                              puVar31 = puVar31 + 1;
                              puVar39 = puVar39 + 1;
                              if (uVar25 != uVar38) {
                                uVar22 = (ulong)(uint)((int)puVar46 - iVar18);
                                puVar39 = puVar46;
                              }
                              iVar29 = (int)uVar22;
                            } while (uVar25 == uVar38);
                          }
                          puVar31 = (ulong *)(ulong)(iVar29 + 4);
                        }
                        else {
                          if (*(uint *)(pLVar24 + uVar10) != uVar33) goto LAB_0011f375;
                          puVar39 = (ulong *)((ulong)uVar7 + (long)puVar11);
                          if (iEnd < puVar39) {
                            puVar39 = iEnd;
                          }
                          puVar31 = (ulong *)(pLVar24 + uVar10 + 4);
                          puVar46 = puVar40;
                          if (puVar40 < (ulong *)((long)puVar39 + -7)) {
                            uVar25 = *puVar40 ^ *(ulong *)(pLVar24 + uVar10 + 4);
                            uVar22 = 0;
                            if (uVar25 != 0) {
                              for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                              }
                            }
                            uVar22 = uVar22 >> 3 & 0x1fffffff;
                            puVar31 = (ulong *)(pLVar24 + uVar10 + 0xc);
                            puVar46 = local_130;
                            if (*(ulong *)(pLVar24 + uVar10 + 4) == *puVar40) goto LAB_0011f159;
                          }
                          else {
LAB_0011f159:
                            do {
                              if ((ulong *)((long)puVar39 + -7) <= puVar46) {
                                if ((puVar46 < (ulong *)((long)puVar39 + -3)) &&
                                   ((uint)*puVar31 == (uint)*puVar46)) {
                                  puVar46 = (ulong *)((long)puVar46 + 4);
                                  puVar31 = (ulong *)((long)puVar31 + 4);
                                }
                                if ((puVar46 < (ulong *)((long)puVar39 + -1)) &&
                                   ((short)*puVar31 == (short)*puVar46)) {
                                  puVar46 = (ulong *)((long)puVar46 + 2);
                                  puVar31 = (ulong *)((long)puVar31 + 2);
                                }
                                if (puVar46 < puVar39) {
                                  puVar46 = (ulong *)((long)puVar46 +
                                                     (ulong)((BYTE)*puVar31 == (BYTE)*puVar46));
                                }
                                uVar22 = (ulong)(uint)((int)puVar46 - iVar18);
                                goto LAB_0011f19e;
                              }
                              uVar22 = *puVar31;
                              uVar25 = *puVar46;
                              uVar12 = uVar25 ^ uVar22;
                              uVar38 = 0;
                              if (uVar12 != 0) {
                                for (; (uVar12 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                                }
                              }
                              iVar29 = (int)puVar46;
                              puVar31 = puVar31 + 1;
                              puVar46 = puVar46 + 1;
                            } while (uVar22 == uVar25);
                            uVar22 = (ulong)((((uint)(uVar38 >> 3) & 0x1fffffff) + iVar29) - iVar18)
                            ;
                          }
LAB_0011f19e:
                          uVar7 = (int)uVar22 + 4;
                          puVar31 = (ulong *)(ulong)uVar7;
                          if ((puVar39 < iEnd) &&
                             (puVar46 = (ulong *)((long)puVar11 + (long)(int)uVar22 + 4),
                             puVar46 == puVar39)) {
                            puVar39 = puVar46;
                            puVar31 = local_170;
                            if (puVar46 < local_168) {
                              uVar25 = *local_170;
                              uVar38 = *puVar46;
                              uVar22 = 0;
                              if ((uVar38 ^ uVar25) != 0) {
                                for (; ((uVar38 ^ uVar25) >> uVar22 & 1) == 0; uVar22 = uVar22 + 1)
                                {
                                }
                              }
                              uVar22 = uVar22 >> 3 & 0x1fffffff;
                              iVar29 = (int)uVar22;
                              if (uVar25 == uVar38) {
                                puVar31 = local_170 + (uVar25 == uVar38);
                                puVar39 = puVar46 + (uVar25 == uVar38);
                                goto LAB_0011f21a;
                              }
                            }
                            else {
LAB_0011f21a:
                              do {
                                if (local_168 <= puVar39) {
                                  if ((puVar39 < local_f8) && ((uint)*puVar31 == (uint)*puVar39)) {
                                    puVar39 = (ulong *)((long)puVar39 + 4);
                                    puVar31 = (ulong *)((long)puVar31 + 4);
                                  }
                                  if ((puVar39 < local_100) && ((short)*puVar31 == (short)*puVar39))
                                  {
                                    puVar39 = (ulong *)((long)puVar39 + 2);
                                    puVar31 = (ulong *)((long)puVar31 + 2);
                                  }
                                  if (puVar39 < iEnd) {
                                    puVar39 = (ulong *)((long)puVar39 +
                                                       (ulong)((BYTE)*puVar31 == (BYTE)*puVar39));
                                  }
                                  iVar29 = (int)puVar39 - (int)puVar46;
                                  break;
                                }
                                uVar25 = *puVar31;
                                uVar38 = *puVar39;
                                uVar12 = 0;
                                if ((uVar38 ^ uVar25) != 0) {
                                  for (; ((uVar38 ^ uVar25) >> uVar12 & 1) == 0; uVar12 = uVar12 + 1
                                      ) {
                                  }
                                }
                                puVar47 = (ulong *)((uVar12 >> 3 & 0x1fffffff) + (long)puVar39);
                                puVar31 = puVar31 + 1;
                                puVar39 = puVar39 + 1;
                                if (uVar25 != uVar38) {
                                  uVar22 = (ulong)(uint)((int)puVar47 - (int)puVar46);
                                  puVar39 = puVar47;
                                }
                                iVar29 = (int)uVar22;
                              } while (uVar25 == uVar38);
                            }
                            puVar31 = (ulong *)(ulong)(uVar7 + iVar29);
                          }
                        }
                        iVar37 = (int)puVar31;
                        if (iVar30 < iVar37) {
                          local_150 = local_1b0 + uVar10;
                        }
                        puVar19 = (ulong *)((ulong)puVar19 & 0xffffffff);
                        pLVar24 = local_1b8;
                        if (iVar30 < iVar37) {
                          puVar19 = puVar31;
                        }
                      }
LAB_0011f375:
                      iVar29 = (int)puVar19;
                      if ((iVar37 == iVar29) && (iVar29 + uVar35 <= (uint)local_1a0)) {
                        uVar7 = 1;
                        if (3 < iVar29) {
                          uVar16 = 0;
                          iVar37 = 0x10;
                          do {
                            uVar2 = ctx->chainTable[uVar16 + uVar35 & 0xffff];
                            iVar30 = iVar37 >> 4;
                            uVar28 = (uint)uVar2;
                            bVar53 = uVar7 < uVar28;
                            iVar37 = iVar37 + 1;
                            if (bVar53) {
                              iVar37 = 0x10;
                            }
                            if (uVar7 <= uVar28) {
                              uVar7 = (uint)uVar2;
                            }
                            if (bVar53) {
                              puVar52 = (ulong *)(ulong)uVar16;
                            }
                            uVar16 = iVar30 + uVar16;
                          } while ((int)uVar16 < iVar29 + -3);
                        }
                        uVar16 = uVar7;
                        if (uVar35 < uVar7) {
                          uVar16 = 0;
                        }
                        bVar50 = uVar35 < uVar7 | 2;
                        if (uVar7 < 2) {
                          uVar16 = 0;
                          bVar50 = 0;
                        }
                        uVar10 = (ulong)(uVar35 - uVar16);
                        pLVar24 = local_1b8;
                        if (uVar7 < 2) goto LAB_0011f413;
                      }
                      else {
LAB_0011f413:
                        bVar5 = 0;
                        bVar50 = 0;
                        if ((ctx->chainTable[uVar10 & 0xffff] == 1) && ((int)puVar52 == 0)) {
                          bVar53 = local_1dc == 0;
                          if (bVar53) {
                            local_1dc = 1;
                          }
                          if (bVar53 && (local_128 & 1) == 0) {
                            uVar35 = LZ4HC_countPattern((BYTE *)puVar40,(BYTE *)iEnd,uVar33);
                            local_138 = (ulong)uVar35 + 4;
                            local_1dc = 2;
                            pLVar24 = local_1b8;
                          }
                          bVar50 = bVar5;
                          if ((local_1dc == 2) && (uVar35 = (int)uVar10 - 1, uVar6 <= uVar35)) {
                            local_188 = (ulong *)CONCAT44(local_188._4_4_,iVar48);
                            uVar7 = (uint)local_178;
                            if (uVar35 - uVar7 < 0xfffffffd) {
                              pLVar27 = pLVar24;
                              if (uVar7 <= uVar35) {
                                pLVar27 = local_1b0;
                              }
                              local_180 = puVar19;
                              if (*(uint *)(pLVar27 + uVar35) == uVar33) {
                                puVar31 = (ulong *)(pLVar27 + uVar35);
                                puVar19 = local_f0;
                                if (uVar7 <= uVar35) {
                                  puVar19 = iEnd;
                                }
                                uVar16 = LZ4HC_countPattern((BYTE *)((long)puVar31 + 4),
                                                            (BYTE *)puVar19,uVar33);
                                puVar39 = local_170;
                                uVar22 = (ulong)uVar16 + 4;
                                puVar46 = local_170;
                                if ((uVar35 < uVar7) &&
                                   (puVar46 = local_b0, (ulong *)(uVar22 + (long)puVar31) == puVar19
                                   )) {
                                  bVar50 = (char)uVar16 * '\b' & 0x1f;
                                  UVar4 = uVar33 << bVar50 | uVar33 >> 0x20 - bVar50;
                                  if ((uVar16 & 3) == 0) {
                                    UVar4 = uVar33;
                                  }
                                  uVar7 = LZ4HC_countPattern((BYTE *)local_170,(BYTE *)iEnd,UVar4);
                                  uVar22 = uVar22 + uVar7;
                                  puVar46 = local_b0;
                                }
                                puVar19 = puVar31;
                                do {
                                  puVar47 = puVar19;
                                  if (puVar47 < (ulong *)((long)puVar46 + 4U)) break;
                                  puVar19 = (ulong *)((long)puVar47 + -4);
                                } while (*(uint *)((long)puVar47 + -4) == uVar33);
                                puVar19 = puVar47;
                                if (puVar46 < puVar47) {
                                  lVar9 = 0;
                                  do {
                                    if (*(char *)((long)puVar47 + lVar9 + -1) !=
                                        *(char *)((long)&local_1bc + lVar9 + 3)) {
                                      puVar19 = (ulong *)((long)puVar47 + lVar9);
                                      break;
                                    }
                                    lVar23 = lVar9 + -1;
                                    lVar9 = lVar9 + -1;
                                    puVar19 = puVar46;
                                  } while (puVar46 < (ulong *)((long)puVar47 + lVar23));
                                }
                                uVar7 = (uint)local_178;
                                uVar10 = (long)puVar31 - (long)puVar19;
                                iVar48 = (int)uVar10;
                                local_1bc = uVar33;
                                if (((uint)local_118 < uVar7 && uVar7 <= uVar35) &&
                                    (ulong *)((long)puVar31 - (uVar10 & 0xffffffff)) == puVar39) {
                                  bVar50 = (char)uVar10 * -8 & 0x1f;
                                  puVar19 = local_f0;
                                  local_1bc = uVar33 << bVar50 | uVar33 >> 0x20 - bVar50;
                                  if ((-iVar48 & 3U) == 0) {
                                    local_1bc = uVar33;
                                  }
                                  do {
                                    puVar31 = puVar19;
                                    if (puVar31 < local_d0) break;
                                    puVar19 = (ulong *)((long)puVar31 + -4);
                                  } while (*(uint *)((long)puVar31 + -4) == local_1bc);
                                  puVar19 = puVar31;
                                  if (local_b0 < puVar31) {
                                    lVar9 = 0;
                                    do {
                                      if (*(char *)((long)puVar31 + lVar9 + -1) !=
                                          *(char *)((long)&local_1bc + lVar9 + 3)) {
                                        puVar19 = (ulong *)((long)puVar31 + lVar9);
                                        break;
                                      }
                                      lVar23 = lVar9 + -1;
                                      lVar9 = lVar9 + -1;
                                      puVar19 = local_b0;
                                    } while (local_b0 < (ulong *)((long)puVar31 + lVar23));
                                  }
                                  iVar48 = ((int)local_f0 - (int)puVar19) + iVar48;
                                }
                                uVar16 = uVar35 - iVar48;
                                if (uVar35 - iVar48 <= uVar6) {
                                  uVar16 = uVar6;
                                }
                                uVar10 = (ulong)uVar16;
                                uVar25 = (uVar35 - uVar16) + uVar22;
                                puVar19 = local_180;
                                if ((local_138 < uVar22) || (uVar25 < local_138)) {
                                  bVar50 = 0;
                                  if (uVar16 - uVar7 < 0xfffffffd) {
                                    if (local_138 <= uVar25) {
                                      uVar25 = local_138;
                                    }
                                    if ((ulong)(long)(int)local_180 < uVar25) {
                                      bVar50 = 3;
                                      if (0xffff < local_1a0 - (ulong)uVar16) goto LAB_0011f6e9;
                                      local_150 = local_1b0 + uVar16;
                                      puVar19 = (ulong *)(uVar25 & 0xffffffff);
                                    }
                                    uVar35 = (uint)ctx->chainTable[uVar10 & 0xffff];
                                    bVar50 = (uVar16 < uVar35) * '\x03';
                                    if (uVar16 < uVar35) {
                                      uVar35 = 0;
                                    }
                                    uVar10 = (ulong)(uVar16 - uVar35);
                                  }
                                  else {
                                    uVar10 = local_178 & 0xffffffff;
                                  }
                                }
                                else {
                                  uVar35 = (uVar35 - (int)local_138) + (int)uVar22;
                                  if (0xfffffffc < uVar35 - uVar7) {
                                    uVar35 = uVar7;
                                  }
                                  bVar50 = 0;
                                  uVar10 = (ulong)uVar35;
                                }
LAB_0011f6e9:
                                pLVar24 = local_1b8;
                                iVar48 = (int)local_188;
                                if (bVar50 == 0) {
                                  bVar50 = 2;
                                }
                              }
                            }
                          }
                        }
                        if (bVar50 == 0) {
                          uVar10 = (ulong)((int)uVar10 -
                                          (uint)ctx->chainTable[(int)puVar52 + (int)uVar10 & 0xffff]
                                          );
                          bVar50 = 0;
                        }
                      }
                      iVar48 = iVar48 + -1;
                    } while (bVar50 != 3);
                    local_180 = puVar19;
                    if (((dict == usingDictCtxHc) && (0 < iVar48)) &&
                       ((int)local_1a0 - uVar6 < 0xffff)) {
                      pLVar24 = local_e0->base;
                      lVar9 = (long)local_e0->end - (long)pLVar24;
                      uVar35 = local_e0->hashTable[*puVar11 * -0x61c8864f >> 0x11];
                      uVar6 = (uVar6 + uVar35) - (int)lVar9;
                      while (((int)local_1a0 - uVar6 < 0x10000 &&
                             (bVar53 = iVar48 != 0, iVar48 = iVar48 + -1, bVar53))) {
                        uVar10 = (ulong)uVar35;
                        if (*(uint *)(pLVar24 + uVar10) == uVar33) {
                          puVar19 = (ulong *)((lVar9 - uVar10) + (long)puVar11);
                          if (iEnd < puVar19) {
                            puVar19 = iEnd;
                          }
                          puVar31 = (ulong *)(pLVar24 + uVar10 + 4);
                          puVar39 = puVar40;
                          pLVar42 = ctx;
                          if (puVar40 < (ulong *)((long)puVar19 + -7)) {
                            uVar25 = *puVar40 ^ *(ulong *)(pLVar24 + uVar10 + 4);
                            uVar22 = 0;
                            if (uVar25 != 0) {
                              for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                              }
                            }
                            pLVar42 = (LZ4HC_CCtx_internal *)(uVar22 >> 3 & 0x1fffffff);
                            iVar29 = (int)pLVar42;
                            puVar31 = (ulong *)(pLVar24 + uVar10 + 0xc);
                            puVar39 = local_130;
                            puVar52 = puVar40;
                            if (*(ulong *)(pLVar24 + uVar10 + 4) == *puVar40) goto LAB_0011f9e0;
                          }
                          else {
LAB_0011f9e0:
                            do {
                              if ((ulong *)((long)puVar19 + -7) <= puVar39) {
                                if ((puVar39 < (ulong *)((long)puVar19 + -3)) &&
                                   ((uint)*puVar31 == (uint)*puVar39)) {
                                  puVar39 = (ulong *)((long)puVar39 + 4);
                                  puVar31 = (ulong *)((long)puVar31 + 4);
                                }
                                if ((puVar39 < (ulong *)((long)puVar19 + -1)) &&
                                   ((short)*puVar31 == (short)*puVar39)) {
                                  puVar39 = (ulong *)((long)puVar39 + 2);
                                  puVar31 = (ulong *)((long)puVar31 + 2);
                                }
                                if (puVar39 < puVar19) {
                                  puVar39 = (ulong *)((long)puVar39 +
                                                     (ulong)((BYTE)*puVar31 == (BYTE)*puVar39));
                                }
                                iVar29 = (int)puVar39 - iVar18;
                                break;
                              }
                              uVar10 = *puVar31;
                              uVar25 = *puVar39 ^ uVar10;
                              uVar22 = 0;
                              if (uVar25 != 0) {
                                for (; (uVar25 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                                }
                              }
                              puVar52 = (ulong *)((uVar22 >> 3 & 0x1fffffff) + (long)puVar39);
                              puVar31 = puVar31 + 1;
                              bVar53 = uVar10 == *puVar39;
                              puVar39 = puVar39 + 1;
                              if (!bVar53) {
                                puVar39 = puVar52;
                              }
                              pLVar42 = (LZ4HC_CCtx_internal *)((ulong)pLVar42 & 0xffffffff);
                              if (!bVar53) {
                                pLVar42 = (LZ4HC_CCtx_internal *)
                                          (ulong)(uint)((int)puVar52 - iVar18);
                              }
                              iVar29 = (int)pLVar42;
                            } while (bVar53);
                          }
                          bVar53 = (int)local_180 < (int)(iVar29 + 4U);
                          if (bVar53) {
                            local_150 = local_1b0 + uVar6;
                            local_180 = (ulong *)(ulong)(iVar29 + 4U);
                          }
                        }
                        uVar7 = uVar35 & 0xffff;
                        uVar35 = uVar35 - local_e0->chainTable[uVar7];
                        uVar6 = uVar6 - local_e0->chainTable[uVar7];
                      }
                    }
                    if ((int)local_9c < (int)local_180) {
                      uVar10 = (ulong)local_180 & 0xffffffff;
                      if ((int)local_180 - 0x13U < 0x12) {
                        uVar10 = 0x12;
                      }
                      if (favorDecSpeed == favorCompressionRatio) {
                        uVar10 = (ulong)local_180 & 0xffffffff;
                      }
                      iVar48 = (int)local_150;
                      goto LAB_0011fb6e;
                    }
LAB_0011fb77:
                    puVar40 = (ulong *)0x0;
                  }
                  else {
                    uVar35 = (uint)((long)puVar11 - (long)pLVar24);
                    uVar6 = uVar35 - 0xffff;
                    if (uVar35 < local_bc) {
                      uVar6 = (uint)local_118;
                    }
                    uVar33 = *puVar11;
                    uVar10 = (ulong)ctx->nextToUpdate;
                    if (ctx->nextToUpdate < uVar35) {
                      do {
                        uVar16 = (uint)(*(int *)(pLVar24 + uVar10) * -0x61c8864f) >> 0x11;
                        uVar7 = (uint)uVar10;
                        uVar28 = uVar7 - ctx->hashTable[uVar16];
                        if (0xfffe < uVar28) {
                          uVar28 = 0xffff;
                        }
                        ctx->chainTable[uVar7 & 0xffff] = (LZ4_u16)uVar28;
                        ctx->hashTable[uVar16] = uVar7;
                        uVar10 = uVar10 + 1;
                      } while (local_120 != uVar10);
                    }
                    ctx->nextToUpdate = uVar35;
                    uVar22 = (ulong)ctx->hashTable[*puVar11 * -0x61c8864f >> 0x11];
                    puVar40 = (ulong *)(puVar11 + 1);
                    local_130 = (ulong *)(puVar11 + 3);
                    local_150 = (LZ4_byte *)
                                CONCAT71(local_150._1_7_,
                                         uVar33 >> 0x18 != (uVar33 & 0xff) ||
                                         uVar33 >> 0x10 != (uVar33 & 0xffff));
                    uVar10 = 3;
                    local_188 = (ulong *)0x0;
                    local_138 = 0;
                    local_180 = (ulong *)((ulong)local_180 & 0xffffffff00000000);
                    puVar52 = (ulong *)0x0;
                    local_1a0 = CONCAT44(local_1a0._4_4_,local_104);
                    pLVar27 = local_1b8;
                    do {
                      uVar7 = (uint)uVar22;
                      local_1d8 = (int)puVar40;
                      if ((uVar7 < uVar6) || ((int)(uint)local_1a0 < 1)) break;
                      uVar25 = 0;
                      iVar48 = 0;
                      if ((favorDecSpeed == favorCompressionRatio) || (7 < uVar35 - uVar7)) {
                        uVar16 = (uint)local_178 - uVar7;
                        iVar18 = (int)uVar10;
                        if ((uint)local_178 < uVar7 || uVar16 == 0) {
                          puVar13 = (uint *)(local_1b0 + uVar22);
                          pLVar27 = local_1b8;
                          if ((*(short *)((long)puVar11 + (long)iVar18 + -1) !=
                               *(short *)((long)iVar18 + -1 + (long)puVar13)) ||
                             (*puVar13 != uVar33)) goto LAB_0011e83f;
                          puVar19 = (ulong *)(puVar13 + 1);
                          puVar31 = puVar40;
                          if (puVar40 < local_168) {
                            uVar38 = *puVar40 ^ *(ulong *)(puVar13 + 1);
                            uVar25 = 0;
                            if (uVar38 != 0) {
                              for (; (uVar38 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                              }
                            }
                            uVar25 = uVar25 >> 3 & 0x1fffffff;
                            iVar48 = (int)uVar25;
                            puVar19 = (ulong *)(puVar13 + 3);
                            puVar31 = local_130;
                            if (*(ulong *)(puVar13 + 1) == *puVar40) goto LAB_0011e7a1;
                          }
                          else {
LAB_0011e7a1:
                            do {
                              if (local_168 <= puVar31) {
                                if ((puVar31 < local_f8) && ((uint)*puVar19 == (uint)*puVar31)) {
                                  puVar31 = (ulong *)((long)puVar31 + 4);
                                  puVar19 = (ulong *)((long)puVar19 + 4);
                                }
                                if ((puVar31 < local_100) && ((short)*puVar19 == (short)*puVar31)) {
                                  puVar31 = (ulong *)((long)puVar31 + 2);
                                  puVar19 = (ulong *)((long)puVar19 + 2);
                                }
                                if (puVar31 < iEnd) {
                                  puVar31 = (ulong *)((long)puVar31 +
                                                     (ulong)((BYTE)*puVar19 == (BYTE)*puVar31));
                                }
                                iVar48 = (int)puVar31 - local_1d8;
                                break;
                              }
                              uVar38 = *puVar19;
                              uVar12 = *puVar31;
                              uVar45 = 0;
                              if ((uVar12 ^ uVar38) != 0) {
                                for (; ((uVar12 ^ uVar38) >> uVar45 & 1) == 0; uVar45 = uVar45 + 1)
                                {
                                }
                              }
                              puVar39 = (ulong *)((uVar45 >> 3 & 0x1fffffff) + (long)puVar31);
                              puVar19 = puVar19 + 1;
                              puVar31 = puVar31 + 1;
                              if (uVar38 != uVar12) {
                                uVar25 = (ulong)(uint)((int)puVar39 - local_1d8);
                                puVar31 = puVar39;
                              }
                              iVar48 = (int)uVar25;
                            } while (uVar38 == uVar12);
                          }
                          uVar25 = (ulong)(iVar48 + 4);
                        }
                        else {
                          if (*(uint *)(pLVar27 + uVar22) != uVar33) goto LAB_0011e83f;
                          puVar19 = (ulong *)((ulong)uVar16 + (long)puVar11);
                          if (iEnd < puVar19) {
                            puVar19 = iEnd;
                          }
                          puVar31 = (ulong *)(pLVar27 + uVar22 + 4);
                          puVar39 = puVar40;
                          if (puVar40 < (ulong *)((long)puVar19 + -7)) {
                            uVar38 = *puVar40 ^ *(ulong *)(pLVar27 + uVar22 + 4);
                            uVar25 = 0;
                            if (uVar38 != 0) {
                              for (; (uVar38 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                              }
                            }
                            uVar38 = uVar25 >> 3 & 0x1fffffff;
                            puVar31 = (ulong *)(pLVar27 + uVar22 + 0xc);
                            puVar39 = local_130;
                            if (*(ulong *)(pLVar27 + uVar22 + 4) == *puVar40) goto LAB_0011e626;
                          }
                          else {
LAB_0011e626:
                            do {
                              if ((ulong *)((long)puVar19 + -7) <= puVar39) {
                                if ((puVar39 < (ulong *)((long)puVar19 + -3)) &&
                                   ((uint)*puVar31 == (uint)*puVar39)) {
                                  puVar39 = (ulong *)((long)puVar39 + 4);
                                  puVar31 = (ulong *)((long)puVar31 + 4);
                                }
                                if ((puVar39 < (ulong *)((long)puVar19 + -1)) &&
                                   ((short)*puVar31 == (short)*puVar39)) {
                                  puVar39 = (ulong *)((long)puVar39 + 2);
                                  puVar31 = (ulong *)((long)puVar31 + 2);
                                }
                                if (puVar39 < puVar19) {
                                  puVar39 = (ulong *)((long)puVar39 +
                                                     (ulong)((BYTE)*puVar31 == (BYTE)*puVar39));
                                }
                                uVar38 = (ulong)(uint)((int)puVar39 - local_1d8);
                                goto LAB_0011e66a;
                              }
                              uVar25 = *puVar31;
                              uVar38 = *puVar39;
                              uVar45 = uVar38 ^ uVar25;
                              uVar12 = 0;
                              if (uVar45 != 0) {
                                for (; (uVar45 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                                }
                              }
                              iVar48 = (int)puVar39;
                              puVar31 = puVar31 + 1;
                              puVar39 = puVar39 + 1;
                            } while (uVar25 == uVar38);
                            uVar38 = (ulong)((((uint)(uVar12 >> 3) & 0x1fffffff) + iVar48) -
                                            local_1d8);
                          }
LAB_0011e66a:
                          uVar16 = (int)uVar38 + 4;
                          uVar25 = (ulong)uVar16;
                          if ((puVar19 < iEnd) &&
                             (puVar31 = (ulong *)((long)puVar11 + (long)(int)uVar38 + 4),
                             puVar31 == puVar19)) {
                            puVar39 = puVar31;
                            puVar19 = local_170;
                            if (puVar31 < local_168) {
                              uVar25 = *local_170;
                              uVar12 = *puVar31;
                              uVar38 = 0;
                              if ((uVar12 ^ uVar25) != 0) {
                                for (; ((uVar12 ^ uVar25) >> uVar38 & 1) == 0; uVar38 = uVar38 + 1)
                                {
                                }
                              }
                              uVar38 = uVar38 >> 3 & 0x1fffffff;
                              iVar48 = (int)uVar38;
                              if (uVar25 == uVar12) {
                                puVar19 = local_170 + (uVar25 == uVar12);
                                puVar39 = puVar31 + (uVar25 == uVar12);
                                goto LAB_0011e6e6;
                              }
                            }
                            else {
LAB_0011e6e6:
                              do {
                                if (local_168 <= puVar39) {
                                  if ((puVar39 < local_f8) && ((uint)*puVar19 == (uint)*puVar39)) {
                                    puVar39 = (ulong *)((long)puVar39 + 4);
                                    puVar19 = (ulong *)((long)puVar19 + 4);
                                  }
                                  if ((puVar39 < local_100) && ((short)*puVar19 == (short)*puVar39))
                                  {
                                    puVar39 = (ulong *)((long)puVar39 + 2);
                                    puVar19 = (ulong *)((long)puVar19 + 2);
                                  }
                                  if (puVar39 < iEnd) {
                                    puVar39 = (ulong *)((long)puVar39 +
                                                       (ulong)((BYTE)*puVar19 == (BYTE)*puVar39));
                                  }
                                  iVar48 = (int)puVar39 - (int)puVar31;
                                  break;
                                }
                                uVar25 = *puVar19;
                                uVar12 = *puVar39;
                                uVar45 = 0;
                                if ((uVar12 ^ uVar25) != 0) {
                                  for (; ((uVar12 ^ uVar25) >> uVar45 & 1) == 0; uVar45 = uVar45 + 1
                                      ) {
                                  }
                                }
                                puVar46 = (ulong *)((uVar45 >> 3 & 0x1fffffff) + (long)puVar39);
                                puVar19 = puVar19 + 1;
                                puVar39 = puVar39 + 1;
                                if (uVar25 != uVar12) {
                                  uVar38 = (ulong)(uint)((int)puVar46 - (int)puVar31);
                                  puVar39 = puVar46;
                                }
                                iVar48 = (int)uVar38;
                              } while (uVar25 == uVar12);
                            }
                            uVar25 = (ulong)(uVar16 + iVar48);
                          }
                        }
                        iVar48 = (int)uVar25;
                        if (iVar18 < iVar48) {
                          local_188 = (ulong *)(local_1b0 + uVar22);
                        }
                        uVar10 = uVar10 & 0xffffffff;
                        pLVar27 = local_1b8;
                        if (iVar18 < iVar48) {
                          uVar10 = uVar25;
                        }
                      }
LAB_0011e83f:
                      iVar18 = (int)uVar10;
                      if ((iVar48 == iVar18) && (iVar18 + uVar7 <= uVar35)) {
                        uVar16 = 1;
                        if (3 < iVar18) {
                          uVar28 = 0;
                          iVar48 = 0x10;
                          do {
                            uVar2 = ctx->chainTable[uVar28 + uVar7 & 0xffff];
                            iVar29 = iVar48 >> 4;
                            uVar49 = (uint)uVar2;
                            bVar53 = uVar16 < uVar49;
                            iVar48 = iVar48 + 1;
                            if (bVar53) {
                              iVar48 = 0x10;
                            }
                            if (uVar16 <= uVar49) {
                              uVar16 = (uint)uVar2;
                            }
                            if (bVar53) {
                              puVar52 = (ulong *)(ulong)uVar28;
                            }
                            uVar28 = iVar29 + uVar28;
                          } while ((int)uVar28 < iVar18 + -3);
                        }
                        uVar28 = uVar16;
                        if (uVar7 < uVar16) {
                          uVar28 = 0;
                        }
                        bVar50 = uVar7 < uVar16 | 2;
                        if (uVar16 < 2) {
                          uVar28 = 0;
                          bVar50 = 0;
                        }
                        uVar22 = (ulong)(uVar7 - uVar28);
                        pLVar27 = local_1b8;
                        if (uVar16 < 2) goto LAB_0011e8dd;
                      }
                      else {
LAB_0011e8dd:
                        bVar50 = 0;
                        bVar5 = 0;
                        if ((ctx->chainTable[uVar22 & 0xffff] == 1) && ((int)puVar52 == 0)) {
                          iVar48 = (int)local_180;
                          if ((int)local_180 == 0) {
                            iVar48 = 1;
                          }
                          if ((int)local_180 == 0 && ((ulong)local_150 & 1) == 0) {
                            uVar7 = LZ4HC_countPattern((BYTE *)puVar40,(BYTE *)iEnd,uVar33);
                            local_138 = (ulong)uVar7 + 4;
                            iVar48 = 2;
                            pLVar27 = local_1b8;
                          }
                          local_180 = (ulong *)CONCAT44(local_180._4_4_,iVar48);
                          if (((iVar48 == 2) &&
                              (uVar7 = (int)uVar22 - 1, bVar50 = bVar5, uVar6 <= uVar7)) &&
                             (uVar16 = (uint)local_178, uVar7 - uVar16 < 0xfffffffd)) {
                            pLVar26 = pLVar27;
                            if (uVar16 <= uVar7) {
                              pLVar26 = local_1b0;
                            }
                            local_128 = uVar10;
                            if (*(uint *)(pLVar26 + uVar7) == uVar33) {
                              puVar31 = (ulong *)(pLVar26 + uVar7);
                              puVar19 = local_f0;
                              if (uVar16 <= uVar7) {
                                puVar19 = iEnd;
                              }
                              uVar28 = LZ4HC_countPattern((BYTE *)((long)puVar31 + 4),
                                                          (BYTE *)puVar19,uVar33);
                              puVar39 = local_170;
                              uVar25 = (ulong)uVar28 + 4;
                              puVar46 = local_170;
                              if ((uVar7 < uVar16) &&
                                 (puVar46 = local_a8, (ulong *)(uVar25 + (long)puVar31) == puVar19))
                              {
                                bVar50 = (char)uVar28 * '\b' & 0x1f;
                                UVar4 = uVar33 << bVar50 | uVar33 >> 0x20 - bVar50;
                                if ((uVar28 & 3) == 0) {
                                  UVar4 = uVar33;
                                }
                                uVar16 = LZ4HC_countPattern((BYTE *)local_170,(BYTE *)iEnd,UVar4);
                                uVar25 = uVar25 + uVar16;
                                puVar46 = local_a8;
                              }
                              puVar19 = puVar31;
                              do {
                                puVar47 = puVar19;
                                if (puVar47 < (ulong *)((long)puVar46 + 4U)) break;
                                puVar19 = (ulong *)((long)puVar47 + -4);
                              } while (*(uint *)((long)puVar47 + -4) == uVar33);
                              puVar19 = puVar47;
                              if (puVar46 < puVar47) {
                                lVar9 = 0;
                                do {
                                  if (*(char *)((long)puVar47 + lVar9 + -1) !=
                                      *(char *)((long)&local_1bc + lVar9 + 3)) {
                                    puVar19 = (ulong *)((long)puVar47 + lVar9);
                                    break;
                                  }
                                  lVar23 = lVar9 + -1;
                                  lVar9 = lVar9 + -1;
                                  puVar19 = puVar46;
                                } while (puVar46 < (ulong *)((long)puVar47 + lVar23));
                              }
                              uVar16 = (uint)local_178;
                              uVar10 = (long)puVar31 - (long)puVar19;
                              iVar48 = (int)uVar10;
                              local_1bc = uVar33;
                              if (((uint)local_118 < uVar16 && uVar16 <= uVar7) &&
                                  (ulong *)((long)puVar31 - (uVar10 & 0xffffffff)) == puVar39) {
                                bVar50 = (char)uVar10 * -8 & 0x1f;
                                puVar19 = local_f0;
                                local_1bc = uVar33 << bVar50 | uVar33 >> 0x20 - bVar50;
                                if ((-iVar48 & 3U) == 0) {
                                  local_1bc = uVar33;
                                }
                                do {
                                  puVar31 = puVar19;
                                  if (puVar31 < local_d0) break;
                                  puVar19 = (ulong *)((long)puVar31 + -4);
                                } while (*(uint *)((long)puVar31 + -4) == local_1bc);
                                puVar19 = puVar31;
                                if (local_a8 < puVar31) {
                                  lVar9 = 0;
                                  do {
                                    if (*(char *)((long)puVar31 + lVar9 + -1) !=
                                        *(char *)((long)&local_1bc + lVar9 + 3)) {
                                      puVar19 = (ulong *)((long)puVar31 + lVar9);
                                      break;
                                    }
                                    lVar23 = lVar9 + -1;
                                    lVar9 = lVar9 + -1;
                                    puVar19 = local_a8;
                                  } while (local_a8 < (ulong *)((long)puVar31 + lVar23));
                                }
                                iVar48 = ((int)local_f0 - (int)puVar19) + iVar48;
                              }
                              uVar28 = uVar7 - iVar48;
                              if (uVar7 - iVar48 <= uVar6) {
                                uVar28 = uVar6;
                              }
                              uVar22 = (ulong)uVar28;
                              uVar38 = (uVar7 - uVar28) + uVar25;
                              uVar10 = local_128;
                              if ((local_138 < uVar25) || (uVar38 < local_138)) {
                                bVar50 = 0;
                                if (uVar28 - uVar16 < 0xfffffffd) {
                                  if (local_138 <= uVar38) {
                                    uVar38 = local_138;
                                  }
                                  if ((ulong)(long)(int)local_128 < uVar38) {
                                    bVar50 = 3;
                                    if (0xffff < ((long)puVar11 - (long)pLVar24) - (ulong)uVar28)
                                    goto LAB_0011ebab;
                                    local_188 = (ulong *)(local_1b0 + uVar28);
                                    uVar10 = uVar38 & 0xffffffff;
                                  }
                                  uVar7 = (uint)ctx->chainTable[uVar22 & 0xffff];
                                  bVar50 = (uVar28 < uVar7) * '\x03';
                                  if (uVar28 < uVar7) {
                                    uVar7 = 0;
                                  }
                                  uVar22 = (ulong)(uVar28 - uVar7);
                                }
                                else {
                                  uVar22 = local_178 & 0xffffffff;
                                }
                              }
                              else {
                                uVar7 = (uVar7 - (int)local_138) + (int)uVar25;
                                if (0xfffffffc < uVar7 - uVar16) {
                                  uVar7 = uVar16;
                                }
                                bVar50 = 0;
                                uVar22 = (ulong)uVar7;
                              }
LAB_0011ebab:
                              pLVar27 = local_1b8;
                              if (bVar50 == 0) {
                                bVar50 = 2;
                              }
                            }
                          }
                        }
                        if (bVar50 == 0) {
                          uVar22 = (ulong)((int)uVar22 -
                                          (uint)ctx->chainTable[(int)puVar52 + (int)uVar22 & 0xffff]
                                          );
                          bVar50 = 0;
                        }
                      }
                      local_1a0 = CONCAT44(local_1a0._4_4_,(uint)local_1a0 + -1);
                    } while (bVar50 != 3);
                    uVar7 = (uint)uVar10;
                    if (((dict == usingDictCtxHc) && (0 < (int)(uint)local_1a0)) &&
                       (uVar35 - uVar6 < 0xffff)) {
                      pLVar24 = local_e0->base;
                      lVar9 = (long)local_e0->end - (long)pLVar24;
                      uVar16 = local_e0->hashTable[*puVar11 * -0x61c8864f >> 0x11];
                      for (uVar6 = (uVar6 + uVar16) - (int)lVar9; uVar35 - uVar6 < 0x10000;
                          uVar6 = uVar6 - local_e0->chainTable[uVar28]) {
                        uVar7 = (uint)uVar10;
                        bVar53 = (uint)local_1a0 == 0;
                        local_1a0._4_4_ = (undefined4)((ulong)local_1a0 >> 0x20);
                        local_1a0 = CONCAT44(local_1a0._4_4_,(uint)local_1a0 + -1);
                        if (bVar53) break;
                        uVar22 = (ulong)uVar16;
                        if (*(uint *)(pLVar24 + uVar22) == uVar33) {
                          puVar19 = (ulong *)((lVar9 - uVar22) + (long)puVar11);
                          if (iEnd < puVar19) {
                            puVar19 = iEnd;
                          }
                          puVar31 = (ulong *)(pLVar24 + uVar22 + 4);
                          puVar39 = puVar40;
                          pLVar42 = ctx;
                          puVar52 = puVar40;
                          if (puVar40 < (ulong *)((long)puVar19 + -7)) {
                            uVar38 = *puVar40 ^ *(ulong *)(pLVar24 + uVar22 + 4);
                            uVar25 = 0;
                            if (uVar38 != 0) {
                              for (; (uVar38 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                              }
                            }
                            pLVar42 = (LZ4HC_CCtx_internal *)(uVar25 >> 3 & 0x1fffffff);
                            iVar48 = (int)pLVar42;
                            puVar31 = (ulong *)(pLVar24 + uVar22 + 0xc);
                            puVar39 = local_130;
                            if (*(ulong *)(pLVar24 + uVar22 + 4) == *puVar40) goto LAB_0011ee9b;
                          }
                          else {
LAB_0011ee9b:
                            do {
                              if ((ulong *)((long)puVar19 + -7) <= puVar39) {
                                if ((puVar39 < (ulong *)((long)puVar19 + -3)) &&
                                   ((uint)*puVar31 == (uint)*puVar39)) {
                                  puVar39 = (ulong *)((long)puVar39 + 4);
                                  puVar31 = (ulong *)((long)puVar31 + 4);
                                }
                                if ((puVar39 < (ulong *)((long)puVar19 + -1)) &&
                                   ((short)*puVar31 == (short)*puVar39)) {
                                  puVar39 = (ulong *)((long)puVar39 + 2);
                                  puVar31 = (ulong *)((long)puVar31 + 2);
                                }
                                if (puVar39 < puVar19) {
                                  puVar39 = (ulong *)((long)puVar39 +
                                                     (ulong)((BYTE)*puVar31 == (BYTE)*puVar39));
                                }
                                iVar48 = (int)puVar39 - local_1d8;
                                break;
                              }
                              uVar22 = *puVar31;
                              uVar38 = *puVar39 ^ uVar22;
                              uVar25 = 0;
                              if (uVar38 != 0) {
                                for (; (uVar38 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                                }
                              }
                              puVar52 = (ulong *)((uVar25 >> 3 & 0x1fffffff) + (long)puVar39);
                              puVar31 = puVar31 + 1;
                              bVar53 = uVar22 == *puVar39;
                              puVar39 = puVar39 + 1;
                              if (!bVar53) {
                                puVar39 = puVar52;
                              }
                              pLVar42 = (LZ4HC_CCtx_internal *)((ulong)pLVar42 & 0xffffffff);
                              if (!bVar53) {
                                pLVar42 = (LZ4HC_CCtx_internal *)
                                          (ulong)(uint)((int)puVar52 - local_1d8);
                              }
                              iVar48 = (int)pLVar42;
                            } while (bVar53);
                          }
                          if ((int)uVar7 < (int)(iVar48 + 4U)) {
                            local_188 = (ulong *)(local_1b0 + uVar6);
                            uVar10 = (ulong)(iVar48 + 4U);
                          }
                        }
                        uVar7 = (uint)uVar10;
                        uVar28 = uVar16 & 0xffff;
                        uVar16 = uVar16 - local_e0->chainTable[uVar28];
                      }
                    }
                    if ((int)uVar7 < 4) goto LAB_0011fb77;
                    uVar10 = (ulong)uVar7;
                    if (uVar7 - 0x13 < 0x12) {
                      uVar10 = 0x12;
                    }
                    if (favorDecSpeed == favorCompressionRatio) {
                      uVar10 = (ulong)uVar7;
                    }
                    iVar48 = (int)local_188;
LAB_0011fb6e:
                    puVar40 = (ulong *)((ulong)(uint)((int)puVar11 - iVar48) | uVar10 << 0x20);
                  }
                  uVar10 = (ulong)puVar40 >> 0x20;
                  bVar50 = 0x11;
                  dst = (char *)local_198;
                  pLVar24 = local_1b0;
                  pvVar8 = local_190;
                  if (uVar10 != 0) {
                    iVar48 = (int)local_158;
                    iVar18 = (int)((ulong)puVar40 >> 0x20);
                    if (iVar48 + iVar18 < 0x1000 && (ulong)((long)puVar40 >> 0x20) <= local_78) {
                      iVar29 = *(int *)((long)local_190 + local_38 + 0xc);
                      lVar9 = (long)iVar29;
                      iVar37 = iVar29 + 1 + (iVar29 - 0xfU) / 0xff;
                      if (lVar9 < 0xf) {
                        iVar37 = iVar29;
                      }
                      iVar30 = iVar29 + 2;
                      uVar35 = iVar29 - 0xe;
                      iVar41 = 1;
                      lVar23 = 0;
                      do {
                        lVar9 = lVar9 + 1;
                        if (lVar9 < 0xf) {
                          iVar43 = iVar41 + iVar29;
                        }
                        else {
                          iVar43 = uVar35 / 0xff + iVar30;
                        }
                        iVar43 = (*local_160 - iVar37) + iVar43;
                        if (iVar43 < *(int *)(local_d8 + lVar23)) {
                          *(undefined8 *)(local_d8 + 4 + lVar23) = 0x100000000;
                          *(uint *)(local_d8 + 0xc + lVar23) = uVar35 + 0xf;
                          *(int *)(local_d8 + lVar23) = iVar43;
                        }
                        iVar41 = iVar41 + 1;
                        lVar23 = lVar23 + 0x10;
                        iVar30 = iVar30 + 1;
                        uVar35 = uVar35 + 1;
                      } while (lVar23 != 0x30);
                      if (3 < iVar18) {
                        uVar22 = 4;
                        piVar20 = local_70;
                        do {
                          iVar18 = (int)uVar22;
                          if (local_160[2] == 1) {
                            uVar35 = local_160[3];
                            iVar37 = 0;
                            if ((long)(int)uVar35 < (long)local_158) {
                              iVar37 = *(int *)((long)local_190 +
                                               (long)(int)(iVar48 - uVar35) * 0x10);
                            }
                            uVar6 = uVar35;
                            if (0xe < (int)uVar35) {
                              uVar6 = (uVar35 - 0xf) / 0xff + uVar35 + 1;
                            }
                            iVar29 = uVar6 + 3;
                            if (0x12 < uVar22) {
                              iVar29 = iVar29 + (iVar18 - 0x13U) / 0xff + 1;
                            }
                            iVar29 = iVar29 + iVar37;
                          }
                          else {
                            iVar29 = 3;
                            if (0x12 < uVar22) {
                              iVar29 = (iVar18 - 0x13U) / 0xff + 4;
                            }
                            iVar29 = iVar29 + *local_160;
                            uVar35 = 0;
                          }
                          if (((int)local_1a8 + 3 < (int)local_110 + iVar18 + -4) ||
                             (iVar29 <= (int)(*piVar20 - favorDecSpeed))) {
                            uVar6 = ((int)local_110 + iVar18) - 4;
                            uVar25 = (ulong)uVar6;
                            if ((int)uVar6 < (int)local_1a8) {
                              uVar25 = local_1a8 & 0xffffffff;
                            }
                            if (uVar22 != uVar10) {
                              uVar25 = local_1a8 & 0xffffffff;
                            }
                            piVar20[2] = iVar18;
                            piVar20[1] = (int)puVar40;
                            piVar20[3] = uVar35;
                            *piVar20 = iVar29;
                            local_1a8 = uVar25;
                          }
                          piVar20 = piVar20 + 4;
                          bVar53 = uVar22 != uVar10;
                          uVar22 = uVar22 + 1;
                        } while (bVar53);
                      }
                      lVar9 = (long)(int)(uint)local_1a8 * 0x10 + local_80;
                      iVar48 = 1;
                      lVar23 = 0;
                      do {
                        *(undefined8 *)(lVar9 + -8 + lVar23) = 0x100000000;
                        *(int *)(lVar9 + lVar23) = iVar48;
                        *(int *)(lVar9 + -0xc + lVar23) =
                             *(int *)((long)(int)(uint)local_1a8 * 0x10 + (long)local_190) + iVar48;
                        lVar23 = lVar23 + 0x10;
                        iVar48 = iVar48 + 1;
                      } while (lVar23 != 0x30);
                      bVar50 = 0;
                      puVar52 = puVar40;
                    }
                    else {
                      local_1a8 = (ulong)(iVar48 + 1);
                      bVar50 = 0x12;
                      local_c4 = iVar18;
                      local_c0 = (int)puVar40;
                    }
                  }
                }
              }
              iVar18 = (int)puVar52;
              psVar21 = local_140;
              uVar25 = local_1a8;
              if (bVar50 < 0x11) {
                if (bVar50 != 0) {
                  if (bVar50 != 0xf) goto LAB_001203be;
                  break;
                }
              }
              else if (bVar50 != 0x11) {
                uVar10 = local_158;
                if (bVar50 == 0x12) goto LAB_0012006b;
                goto LAB_001203be;
              }
              uVar10 = local_158 + 1;
              iVar48 = (int)local_120;
              local_d8 = local_d8 + 0x10;
              local_110 = (ulong *)((long)local_110 + 1);
              local_70 = local_70 + 4;
            } while ((long)uVar10 < (long)(int)(uint)local_1a8);
          }
          local_c0 = *(int *)((long)pvVar8 + (long)(int)(uint)local_1a8 * 0x10 + 4);
          local_c4 = *(int *)((long)pvVar8 + (long)(int)(uint)local_1a8 * 0x10 + 8);
          uVar10 = (ulong)((uint)local_1a8 - local_c4);
LAB_0012006b:
          iVar18 = (int)puVar52;
          iVar37 = 0;
          iVar29 = local_c0;
          iVar48 = local_c4;
          do {
            iVar43 = (int)uVar10;
            lVar9 = (long)iVar43 * 0x10;
            iVar30 = *(int *)((long)pvVar8 + lVar9 + 8);
            iVar41 = iVar30;
            if (iVar43 < iVar30) {
              iVar41 = 0;
            }
            iVar3 = *(int *)((long)pvVar8 + lVar9 + 4);
            uVar10 = (ulong)(uint)(iVar43 - iVar41);
            *(int *)((long)pvVar8 + lVar9 + 8) = iVar48;
            *(int *)((long)pvVar8 + lVar9 + 4) = iVar29;
            iVar29 = iVar3;
            iVar48 = iVar30;
          } while (iVar30 <= iVar43);
          psVar51 = local_198;
          if ((int)(uint)local_1a8 < 1) {
            bVar50 = 0;
            psVar21 = local_140;
            dst = (char *)local_198;
            uVar25 = local_1a8;
          }
          else {
            do {
              iVar48 = *(int *)((long)pvVar8 + (long)iVar37 * 0x10 + 8);
              lVar9 = (long)iVar48;
              if (lVar9 == 1) {
                local_1f8 = (uint *)((long)local_1f8 + 1);
                iVar37 = iVar37 + 1;
                bVar50 = 0x1e;
                dst = (char *)psVar51;
              }
              else {
                iVar18 = *(int *)((long)pvVar8 + (long)iVar37 * 0x10 + 4);
                dst = (char *)((long)psVar51 + 1);
                puVar52 = (ulong *)((long)local_1f8 - (long)__src);
                if ((limit == notLimited) ||
                   ((BYTE *)((long)psVar51 + (ulong)puVar52 / 0xff) + (long)puVar52 + 9 <= local_e8)
                   ) {
                  if (puVar52 < (ulong *)0xf) {
                    *(char *)psVar51 = (char)puVar52 << 4;
                    psVar21 = (short *)dst;
                  }
                  else {
                    pBVar34 = (BYTE *)((long)puVar52 + -0xf);
                    *(BYTE *)psVar51 = 0xf0;
                    if ((BYTE *)0xfe < pBVar34) {
                      uVar10 = (ulong)((long)puVar52 + -0x10e) / 0xff;
                      memset(dst,0xff,uVar10 + 1);
                      dst = (char *)((long)psVar51 + uVar10 + 2);
                      pBVar34 = (BYTE *)((long)puVar52 + uVar10 * -0xff + -0x10e);
                      pvVar8 = local_190;
                    }
                    *dst = (BYTE)pBVar34;
                    psVar21 = (short *)((long)dst + 1);
                  }
                  puVar52 = (ulong *)((long)puVar52 + (long)psVar21);
                  lVar23 = 0;
                  do {
                    pBVar34 = (BYTE *)((long)psVar21 + lVar23);
                    *(undefined8 *)pBVar34 = *(undefined8 *)((long)__src + lVar23);
                    lVar23 = lVar23 + 8;
                  } while (pBVar34 + 8 < puVar52);
                  uVar10 = lVar9 - 4;
                  dst = (char *)((long)puVar52 + 2);
                  *(short *)puVar52 = (short)iVar18;
                  if ((limit != notLimited) &&
                     (local_e8 < (BYTE *)((long)puVar52 + uVar10 / 0xff + 8))) goto LAB_0012022a;
                  if (uVar10 < 0xf) {
                    *(BYTE *)psVar51 = (BYTE)*psVar51 + (char)uVar10;
                  }
                  else {
                    *(BYTE *)psVar51 = (BYTE)*psVar51 + '\x0f';
                    uVar10 = lVar9 - 0x13;
                    if (0x1fd < uVar10) {
                      puVar52 = (ulong *)((lVar9 - 0x211U) / 0x1fe);
                      memset(dst,0xff,(long)puVar52 * 2 + 2);
                      dst = (char *)((long)psVar21 +
                                    (long)local_1f8 + ((long)puVar52 * 2 - (long)__src) + 4);
                      uVar10 = ((long)puVar52 * -0x1fe + lVar9) - 0x211;
                    }
                    if (0xfe < uVar10) {
                      uVar10 = uVar10 - 0xff;
                      *dst = 0xff;
                      dst = (char *)((long)dst + 1);
                    }
                    *dst = (BYTE)uVar10;
                    dst = (char *)((long)dst + 1);
                  }
                  __src = (uint *)((long)local_1f8 + lVar9);
                  bVar53 = true;
                  local_1f8 = __src;
                }
                else {
LAB_0012022a:
                  bVar53 = false;
                }
                iVar37 = iVar37 + iVar48;
                bVar50 = 0;
                local_140 = psVar51;
                if (!bVar53) {
                  local_b8 = (long)local_1f8 - (long)iVar18;
                  bVar50 = 5;
                  local_144 = iVar48;
                }
              }
              iVar18 = (int)puVar52;
              psVar21 = local_140;
              uVar25 = local_1a8;
              if ((bVar50 != 0x1e) && (bVar50 != 0)) goto LAB_001203be;
              psVar51 = (short *)dst;
            } while (iVar37 < (int)(uint)local_1a8);
            bVar50 = 0;
          }
        }
      }
LAB_001203be:
      local_1a8 = uVar25;
      source = (char *)local_1f8;
      if ((bVar50 != 0) && (bVar50 != 3)) {
        if (bVar50 != 5) {
          return iVar18;
        }
        iVar48 = 0;
        if (limit != fillOutput) goto LAB_00120676;
        uVar10 = (long)local_1f8 - (long)__src;
        pBVar34 = (BYTE *)((long)psVar21 + (uVar10 + 0xf0) / 0xff + uVar10 + 1);
        dst = (char *)psVar21;
        pvVar8 = local_190;
        if (pBVar34 <= local_e8 + -3) {
          uVar22 = ((long)(local_e8 + -3) - (long)pBVar34) * 0xff + 0x12;
          iVar48 = local_144;
          if (uVar22 < (ulong)(long)local_144) {
            iVar48 = (int)uVar22;
          }
          lVar9 = (long)iVar48;
          if ((long)(pBVar34 + (-3 - (long)(local_e8 + lVar9))) < -0xc) {
            psVar51 = (short *)((long)psVar21 + 1);
            if (uVar10 < 0xf) {
              *(char *)psVar21 = (char)uVar10 << 4;
            }
            else {
              uVar22 = uVar10 - 0xf;
              *(BYTE *)psVar21 = 0xf0;
              if (0xfe < uVar22) {
                uVar22 = (uVar10 - 0x10e) / 0xff;
                memset(psVar51,0xff,uVar22 + 1);
                psVar51 = (short *)((long)psVar21 + uVar22 + 2);
                uVar22 = (uVar22 * -0xff + uVar10) - 0x10e;
              }
              *(BYTE *)psVar51 = (BYTE)uVar22;
              psVar51 = (short *)((long)psVar51 + 1);
            }
            psVar1 = (short *)((long)psVar51 + uVar10);
            psVar14 = psVar51;
            do {
              *(undefined8 *)psVar14 = *(undefined8 *)__src;
              psVar14 = psVar14 + 4;
              __src = __src + 2;
            } while (psVar14 < psVar1);
            *psVar1 = (short)local_1f8 - (short)local_b8;
            dst = (char *)(psVar1 + 1);
            if (lVar9 - 4U < 0xf) {
              *(BYTE *)psVar21 = (BYTE)*psVar21 + (char)(lVar9 - 4U);
            }
            else {
              *(BYTE *)psVar21 = (BYTE)*psVar21 + '\x0f';
              uVar22 = lVar9 - 0x13;
              if (0x1fd < uVar22) {
                uVar22 = (lVar9 - 0x211U) / 0x1fe;
                memset(dst,0xff,uVar22 * 2 + 2);
                dst = (char *)((long)psVar51 + uVar10 + uVar22 * 2 + 4);
                uVar22 = (uVar22 * -0x1fe + lVar9) - 0x211;
              }
              if (0xfe < uVar22) {
                uVar22 = uVar22 - 0xff;
                *dst = 0xff;
                dst = (char *)((long)dst + 1);
              }
              *dst = (BYTE)uVar22;
              dst = (char *)((long)dst + 1);
            }
            source = (char *)((long)local_1f8 + lVar9);
            __src = (uint *)source;
            pvVar8 = local_190;
          }
        }
        break;
      }
      local_140 = psVar21;
    } while (local_1f8 <= local_68);
  }
  iVar18 = (int)source;
  pBVar34 = (BYTE *)(local_88 + -(long)__src);
  if ((limit == notLimited) ||
     (pBVar15 = local_e8 + (ulong)(limit == fillOutput) * 5,
     (BYTE *)((long)dst + (long)(pBVar34 + (ulong)(pBVar34 + 0xf0) / 0xff + 1)) <= pBVar15)) {
LAB_001205ab:
    psVar21 = (short *)((long)dst + 1);
    if (pBVar34 < (BYTE *)0xf) {
      *dst = (char)pBVar34 << 4;
    }
    else {
      pBVar15 = pBVar34 + -0xf;
      *dst = 0xf0;
      psVar51 = psVar21;
      if ((BYTE *)0xfe < pBVar15) {
        uVar10 = (ulong)(pBVar34 + -0x10e) / 0xff;
        memset(psVar21,0xff,uVar10 + 1);
        psVar51 = (short *)((long)dst + uVar10 + 2);
        dst = (char *)((long)dst + uVar10 + 1);
        pBVar15 = pBVar34 + uVar10 * -0xff + -0x10e;
      }
      psVar21 = (short *)((long)dst + 2);
      *(BYTE *)psVar51 = (BYTE)pBVar15;
    }
    iVar18 = (int)__src + (int)pBVar34;
    memcpy(psVar21,__src,(size_t)pBVar34);
    dst = (char *)((long)psVar21 + (long)pBVar34);
    bVar53 = true;
  }
  else {
    if (limit != limitedOutput) {
      pBVar34 = pBVar15 + (~(ulong)dst - ((ulong)(pBVar15 + ~(ulong)dst + 0xf1) >> 8));
      goto LAB_001205ab;
    }
    bVar53 = false;
  }
  iVar48 = 0;
  if (bVar53) {
    *local_60 = iVar18 - (int)local_98;
    iVar48 = (int)dst - (int)local_90;
  }
LAB_00120676:
  free(pvVar8);
  return iVar48;
}

Assistant:

static int LZ4HC_compress_optimal ( LZ4HC_CCtx_internal* ctx,
                                    const char* const source,
                                    char* dst,
                                    int* srcSizePtr,
                                    int dstCapacity,
                                    int const nbSearches,
                                    size_t sufficient_len,
                                    const limitedOutput_directive limit,
                                    int const fullUpdate,
                                    const dictCtx_directive dict,
                                    const HCfavor_e favorDecSpeed)
{
    int retval = 0;
#define TRAILING_LITERALS 3
#ifdef LZ4HC_HEAPMODE
    LZ4HC_optimal_t* const opt = (LZ4HC_optimal_t*)ALLOC(sizeof(LZ4HC_optimal_t) * (LZ4_OPT_NUM + TRAILING_LITERALS));
#else
    LZ4HC_optimal_t opt[LZ4_OPT_NUM + TRAILING_LITERALS];   /* ~64 KB, which is a bit large for stack... */
#endif

    const BYTE* ip = (const BYTE*) source;
    const BYTE* anchor = ip;
    const BYTE* const iend = ip + *srcSizePtr;
    const BYTE* const mflimit = iend - MFLIMIT;
    const BYTE* const matchlimit = iend - LASTLITERALS;
    BYTE* op = (BYTE*) dst;
    BYTE* opSaved = (BYTE*) dst;
    BYTE* oend = op + dstCapacity;
    int ovml = MINMATCH;  /* overflow - last sequence */
    const BYTE* ovref = NULL;

    /* init */
#ifdef LZ4HC_HEAPMODE
    if (opt == NULL) goto _return_label;
#endif
    DEBUGLOG(5, "LZ4HC_compress_optimal(dst=%p, dstCapa=%u)", dst, (unsigned)dstCapacity);
    *srcSizePtr = 0;
    if (limit == fillOutput) oend -= LASTLITERALS;   /* Hack for support LZ4 format restriction */
    if (sufficient_len >= LZ4_OPT_NUM) sufficient_len = LZ4_OPT_NUM-1;

    /* Main Loop */
    while (ip <= mflimit) {
         int const llen = (int)(ip - anchor);
         int best_mlen, best_off;
         int cur, last_match_pos = 0;

         LZ4HC_match_t const firstMatch = LZ4HC_FindLongerMatch(ctx, ip, matchlimit, MINMATCH-1, nbSearches, dict, favorDecSpeed);
         if (firstMatch.len==0) { ip++; continue; }

         if ((size_t)firstMatch.len > sufficient_len) {
             /* good enough solution : immediate encoding */
             int const firstML = firstMatch.len;
             const BYTE* const matchPos = ip - firstMatch.off;
             opSaved = op;
             if ( LZ4HC_encodeSequence(UPDATABLE(ip, op, anchor), firstML, matchPos, limit, oend) ) {  /* updates ip, op and anchor */
                 ovml = firstML;
                 ovref = matchPos;
                 goto _dest_overflow;
             }
             continue;
         }

         /* set prices for first positions (literals) */
         {   int rPos;
             for (rPos = 0 ; rPos < MINMATCH ; rPos++) {
                 int const cost = LZ4HC_literalsPrice(llen + rPos);
                 opt[rPos].mlen = 1;
                 opt[rPos].off = 0;
                 opt[rPos].litlen = llen + rPos;
                 opt[rPos].price = cost;
                 DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i) -- initial setup",
                             rPos, cost, opt[rPos].litlen);
         }   }
         /* set prices using initial match */
         {   int mlen = MINMATCH;
             int const matchML = firstMatch.len;   /* necessarily < sufficient_len < LZ4_OPT_NUM */
             int const offset = firstMatch.off;
             assert(matchML < LZ4_OPT_NUM);
             for ( ; mlen <= matchML ; mlen++) {
                 int const cost = LZ4HC_sequencePrice(llen, mlen);
                 opt[mlen].mlen = mlen;
                 opt[mlen].off = offset;
                 opt[mlen].litlen = llen;
                 opt[mlen].price = cost;
                 DEBUGLOG(7, "rPos:%3i => price:%3i (matchlen=%i) -- initial setup",
                             mlen, cost, mlen);
         }   }
         last_match_pos = firstMatch.len;
         {   int addLit;
             for (addLit = 1; addLit <= TRAILING_LITERALS; addLit ++) {
                 opt[last_match_pos+addLit].mlen = 1; /* literal */
                 opt[last_match_pos+addLit].off = 0;
                 opt[last_match_pos+addLit].litlen = addLit;
                 opt[last_match_pos+addLit].price = opt[last_match_pos].price + LZ4HC_literalsPrice(addLit);
                 DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i) -- initial setup",
                             last_match_pos+addLit, opt[last_match_pos+addLit].price, addLit);
         }   }

         /* check further positions */
         for (cur = 1; cur < last_match_pos; cur++) {
             const BYTE* const curPtr = ip + cur;
             LZ4HC_match_t newMatch;

             if (curPtr > mflimit) break;
             DEBUGLOG(7, "rPos:%u[%u] vs [%u]%u",
                     cur, opt[cur].price, opt[cur+1].price, cur+1);
             if (fullUpdate) {
                 /* not useful to search here if next position has same (or lower) cost */
                 if ( (opt[cur+1].price <= opt[cur].price)
                   /* in some cases, next position has same cost, but cost rises sharply after, so a small match would still be beneficial */
                   && (opt[cur+MINMATCH].price < opt[cur].price + 3/*min seq price*/) )
                     continue;
             } else {
                 /* not useful to search here if next position has same (or lower) cost */
                 if (opt[cur+1].price <= opt[cur].price) continue;
             }

             DEBUGLOG(7, "search at rPos:%u", cur);
             if (fullUpdate)
                 newMatch = LZ4HC_FindLongerMatch(ctx, curPtr, matchlimit, MINMATCH-1, nbSearches, dict, favorDecSpeed);
             else
                 /* only test matches of minimum length; slightly faster, but misses a few bytes */
                 newMatch = LZ4HC_FindLongerMatch(ctx, curPtr, matchlimit, last_match_pos - cur, nbSearches, dict, favorDecSpeed);
             if (!newMatch.len) continue;

             if ( ((size_t)newMatch.len > sufficient_len)
               || (newMatch.len + cur >= LZ4_OPT_NUM) ) {
                 /* immediate encoding */
                 best_mlen = newMatch.len;
                 best_off = newMatch.off;
                 last_match_pos = cur + 1;
                 goto encode;
             }

             /* before match : set price with literals at beginning */
             {   int const baseLitlen = opt[cur].litlen;
                 int litlen;
                 for (litlen = 1; litlen < MINMATCH; litlen++) {
                     int const price = opt[cur].price - LZ4HC_literalsPrice(baseLitlen) + LZ4HC_literalsPrice(baseLitlen+litlen);
                     int const pos = cur + litlen;
                     if (price < opt[pos].price) {
                         opt[pos].mlen = 1; /* literal */
                         opt[pos].off = 0;
                         opt[pos].litlen = baseLitlen+litlen;
                         opt[pos].price = price;
                         DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i)",
                                     pos, price, opt[pos].litlen);
             }   }   }

             /* set prices using match at position = cur */
             {   int const matchML = newMatch.len;
                 int ml = MINMATCH;

                 assert(cur + newMatch.len < LZ4_OPT_NUM);
                 for ( ; ml <= matchML ; ml++) {
                     int const pos = cur + ml;
                     int const offset = newMatch.off;
                     int price;
                     int ll;
                     DEBUGLOG(7, "testing price rPos %i (last_match_pos=%i)",
                                 pos, last_match_pos);
                     if (opt[cur].mlen == 1) {
                         ll = opt[cur].litlen;
                         price = ((cur > ll) ? opt[cur - ll].price : 0)
                               + LZ4HC_sequencePrice(ll, ml);
                     } else {
                         ll = 0;
                         price = opt[cur].price + LZ4HC_sequencePrice(0, ml);
                     }

                    assert((U32)favorDecSpeed <= 1);
                     if (pos > last_match_pos+TRAILING_LITERALS
                      || price <= opt[pos].price - (int)favorDecSpeed) {
                         DEBUGLOG(7, "rPos:%3i => price:%3i (matchlen=%i)",
                                     pos, price, ml);
                         assert(pos < LZ4_OPT_NUM);
                         if ( (ml == matchML)  /* last pos of last match */
                           && (last_match_pos < pos) )
                             last_match_pos = pos;
                         opt[pos].mlen = ml;
                         opt[pos].off = offset;
                         opt[pos].litlen = ll;
                         opt[pos].price = price;
             }   }   }
             /* complete following positions with literals */
             {   int addLit;
                 for (addLit = 1; addLit <= TRAILING_LITERALS; addLit ++) {
                     opt[last_match_pos+addLit].mlen = 1; /* literal */
                     opt[last_match_pos+addLit].off = 0;
                     opt[last_match_pos+addLit].litlen = addLit;
                     opt[last_match_pos+addLit].price = opt[last_match_pos].price + LZ4HC_literalsPrice(addLit);
                     DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i)", last_match_pos+addLit, opt[last_match_pos+addLit].price, addLit);
             }   }
         }  /* for (cur = 1; cur <= last_match_pos; cur++) */

         assert(last_match_pos < LZ4_OPT_NUM + TRAILING_LITERALS);
         best_mlen = opt[last_match_pos].mlen;
         best_off = opt[last_match_pos].off;
         cur = last_match_pos - best_mlen;

encode: /* cur, last_match_pos, best_mlen, best_off must be set */
         assert(cur < LZ4_OPT_NUM);
         assert(last_match_pos >= 1);  /* == 1 when only one candidate */
         DEBUGLOG(6, "reverse traversal, looking for shortest path (last_match_pos=%i)", last_match_pos);
         {   int candidate_pos = cur;
             int selected_matchLength = best_mlen;
             int selected_offset = best_off;
             while (1) {  /* from end to beginning */
                 int const next_matchLength = opt[candidate_pos].mlen;  /* can be 1, means literal */
                 int const next_offset = opt[candidate_pos].off;
                 DEBUGLOG(7, "pos %i: sequence length %i", candidate_pos, selected_matchLength);
                 opt[candidate_pos].mlen = selected_matchLength;
                 opt[candidate_pos].off = selected_offset;
                 selected_matchLength = next_matchLength;
                 selected_offset = next_offset;
                 if (next_matchLength > candidate_pos) break; /* last match elected, first match to encode */
                 assert(next_matchLength > 0);  /* can be 1, means literal */
                 candidate_pos -= next_matchLength;
         }   }

         /* encode all recorded sequences in order */
         {   int rPos = 0;  /* relative position (to ip) */
             while (rPos < last_match_pos) {
                 int const ml = opt[rPos].mlen;
                 int const offset = opt[rPos].off;
                 if (ml == 1) { ip++; rPos++; continue; }  /* literal; note: can end up with several literals, in which case, skip them */
                 rPos += ml;
                 assert(ml >= MINMATCH);
                 assert((offset >= 1) && (offset <= LZ4_DISTANCE_MAX));
                 opSaved = op;
                 if ( LZ4HC_encodeSequence(UPDATABLE(ip, op, anchor), ml, ip - offset, limit, oend) ) {  /* updates ip, op and anchor */
                     ovml = ml;
                     ovref = ip - offset;
                     goto _dest_overflow;
         }   }   }
     }  /* while (ip <= mflimit) */

_last_literals:
     /* Encode Last Literals */
     {   size_t lastRunSize = (size_t)(iend - anchor);  /* literals */
         size_t llAdd = (lastRunSize + 255 - RUN_MASK) / 255;
         size_t const totalSize = 1 + llAdd + lastRunSize;
         if (limit == fillOutput) oend += LASTLITERALS;  /* restore correct value */
         if (limit && (op + totalSize > oend)) {
             if (limit == limitedOutput) { /* Check output limit */
                retval = 0;
                goto _return_label;
             }
             /* adapt lastRunSize to fill 'dst' */
             lastRunSize  = (size_t)(oend - op) - 1 /*token*/;
             llAdd = (lastRunSize + 256 - RUN_MASK) / 256;
             lastRunSize -= llAdd;
         }
         DEBUGLOG(6, "Final literal run : %i literals", (int)lastRunSize);
         ip = anchor + lastRunSize; /* can be != iend if limit==fillOutput */

         if (lastRunSize >= RUN_MASK) {
             size_t accumulator = lastRunSize - RUN_MASK;
             *op++ = (RUN_MASK << ML_BITS);
             for(; accumulator >= 255 ; accumulator -= 255) *op++ = 255;
             *op++ = (BYTE) accumulator;
         } else {
             *op++ = (BYTE)(lastRunSize << ML_BITS);
         }
         memcpy(op, anchor, lastRunSize);
         op += lastRunSize;
     }

     /* End */
     *srcSizePtr = (int) (((const char*)ip) - source);
     retval = (int) ((char*)op-dst);
     goto _return_label;

_dest_overflow:
if (limit == fillOutput) {
     /* Assumption : ip, anchor, ovml and ovref must be set correctly */
     size_t const ll = (size_t)(ip - anchor);
     size_t const ll_addbytes = (ll + 240) / 255;
     size_t const ll_totalCost = 1 + ll_addbytes + ll;
     BYTE* const maxLitPos = oend - 3; /* 2 for offset, 1 for token */
     DEBUGLOG(6, "Last sequence overflowing (only %i bytes remaining)", (int)(oend-1-opSaved));
     op = opSaved;  /* restore correct out pointer */
     if (op + ll_totalCost <= maxLitPos) {
         /* ll validated; now adjust match length */
         size_t const bytesLeftForMl = (size_t)(maxLitPos - (op+ll_totalCost));
         size_t const maxMlSize = MINMATCH + (ML_MASK-1) + (bytesLeftForMl * 255);
         assert(maxMlSize < INT_MAX); assert(ovml >= 0);
         if ((size_t)ovml > maxMlSize) ovml = (int)maxMlSize;
         if ((oend + LASTLITERALS) - (op + ll_totalCost + 2) - 1 + ovml >= MFLIMIT) {
             DEBUGLOG(6, "Space to end : %i + ml (%i)", (int)((oend + LASTLITERALS) - (op + ll_totalCost + 2) - 1), ovml);
             DEBUGLOG(6, "Before : ip = %p, anchor = %p", ip, anchor);
             LZ4HC_encodeSequence(UPDATABLE(ip, op, anchor), ovml, ovref, notLimited, oend);
             DEBUGLOG(6, "After : ip = %p, anchor = %p", ip, anchor);
     }   }
     goto _last_literals;
}
_return_label:
#ifdef LZ4HC_HEAPMODE
     FREEMEM(opt);
#endif
     return retval;
}